

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_fma::forward_fp16s
          (InnerProduct_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  ulong uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 uVar17;
  _func_int *p_Var18;
  int *piVar19;
  long lVar20;
  void *pvVar21;
  size_t sVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  uint uVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  undefined1 (*pauVar36) [16];
  undefined1 (*pauVar37) [32];
  long lVar38;
  undefined4 *puVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  uint uVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  uint uVar54;
  undefined1 (*pauVar55) [16];
  undefined1 (*pauVar56) [16];
  undefined1 (*pauVar57) [32];
  long lVar58;
  undefined1 (*pauVar59) [16];
  undefined1 auVar60 [16];
  undefined1 auVar68 [16];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [28];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar61 [16];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar127 [64];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar159 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar131 [16];
  undefined1 auVar169 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar139 [16];
  undefined1 auVar181 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar182 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar183 [64];
  float fVar184;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar219 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  v4sf one;
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar287 [64];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  float fVar306;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  float fVar318;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  float fVar319;
  float fVar323;
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [32];
  undefined1 auVar324 [16];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [64];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [64];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [64];
  undefined1 auVar360 [16];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [64];
  Option opt_flatten;
  undefined4 in_stack_fffffffffffffbec;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  long local_358;
  undefined1 local_308 [16];
  size_t local_2f8;
  int local_2f0;
  Allocator *local_2e8;
  int local_2e0;
  int local_2dc;
  undefined8 local_2d8;
  int local_2d0;
  size_t local_2c8;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  float local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_238;
  ulong local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar82 [32];
  undefined1 auVar86 [32];
  undefined1 auVar92 [32];
  float fVar95;
  float fVar128;
  undefined1 auVar160 [32];
  
  local_2e0 = bottom_blob->dims;
  if (local_2e0 == 2) {
    local_2dc = bottom_blob->w;
    if (local_2dc ==
        *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_fma[-3]) /
        *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3])) {
      Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]),
                  bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      p_Var18 = this->_vptr_InnerProduct_x86_fma[-3];
      innerproduct_gemm_fp16s_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 *(Mat **)(&this->field_0x178 + (long)p_Var18),
                 *(int *)(&this->field_0xe0 + (long)p_Var18),
                 (Mat *)(&this->field_0xe8 + (long)p_Var18),
                 (Option *)CONCAT44(in_stack_fffffffffffffbec,(uint)opt->use_packing_layout));
      return 0;
    }
  }
  else {
    local_2dc = bottom_blob->w;
  }
  piVar19 = bottom_blob->refcount;
  local_308._0_8_ = bottom_blob->data;
  local_308._8_8_ = bottom_blob->refcount;
  local_2f8 = bottom_blob->elemsize;
  local_2f0 = bottom_blob->elempack;
  local_2e8 = bottom_blob->allocator;
  local_2d8._0_4_ = bottom_blob->h;
  local_2d8._4_4_ = bottom_blob->d;
  local_2d0 = bottom_blob->c;
  local_2c8 = bottom_blob->cstep;
  iVar41 = local_2e0;
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + 1;
    UNLOCK();
    iVar41 = bottom_blob->dims;
  }
  if (iVar41 != 1) {
    auVar271[0] = opt->lightmode;
    auVar271._1_3_ = *(undefined3 *)&opt->field_0x1;
    auVar271._4_4_ = opt->num_threads;
    auVar271._8_8_ = opt->blob_allocator;
    uVar5 = opt->workspace_allocator;
    uVar6 = opt->openmp_blocktime;
    uVar7 = opt->use_winograd_convolution;
    uVar8 = opt->use_sgemm_convolution;
    uVar9 = opt->use_int8_inference;
    uVar10 = opt->use_vulkan_compute;
    auVar271[0x1f] = uVar10;
    auVar271[0x1e] = uVar9;
    auVar271[0x1d] = uVar8;
    auVar271[0x1c] = uVar7;
    auVar271._24_4_ = uVar6;
    auVar271._16_8_ = uVar5;
    local_58._0_1_ = opt->use_bf16_storage;
    local_58._1_1_ = opt->use_fp16_packed;
    local_58._2_1_ = opt->use_fp16_storage;
    local_58._3_1_ = opt->use_fp16_arithmetic;
    local_58._4_1_ = opt->use_int8_packed;
    local_58._5_1_ = opt->use_int8_storage;
    local_58._6_1_ = opt->use_int8_arithmetic;
    local_58._7_1_ = opt->use_packing_layout;
    uStack_50._0_1_ = opt->use_shader_pack8;
    uStack_50._1_1_ = opt->use_subgroup_basic;
    uStack_50._2_1_ = opt->use_subgroup_vote;
    uStack_50._3_1_ = opt->use_subgroup_ballot;
    uStack_50._4_1_ = opt->use_subgroup_shuffle;
    uStack_50._5_1_ = opt->use_image_storage;
    uStack_50._6_1_ = opt->use_tensor_storage;
    uStack_50._7_1_ = opt->use_reserved_0;
    uStack_48._0_4_ = opt->flush_denormals;
    uStack_48._4_1_ = opt->use_local_pool_allocator;
    uStack_48._5_1_ = opt->use_shader_local_memory;
    uStack_48._6_1_ = opt->use_cooperative_matrix;
    uStack_48._7_1_ = opt->use_winograd23_convolution;
    uStack_40._0_1_ = opt->use_winograd43_convolution;
    uStack_40._1_1_ = opt->use_winograd63_convolution;
    uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = opt->use_reserved_7;
    uStack_40._4_1_ = opt->use_reserved_8;
    uStack_40._5_1_ = opt->use_reserved_9;
    uStack_40._6_1_ = opt->use_reserved_10;
    uStack_40._7_1_ = opt->use_reserved_11;
    local_78 = auVar271._0_8_;
    pAStack_70 = opt->workspace_allocator;
    auStack_68 = auVar271._16_16_;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,local_308);
  }
  uVar30 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]);
  uVar54 = 1;
  if (opt->use_packing_layout == true) {
    uVar54 = 8;
    if ((uVar30 & 7) != 0) {
      uVar54 = (uint)((uVar30 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(int)uVar30 / (int)uVar54,
              (ulong)uVar54 * (local_2f8 / (ulong)(long)local_2f0),uVar54,opt->blob_allocator);
  iVar41 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    p_Var18 = this->_vptr_InnerProduct_x86_fma[-3];
    uVar17 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var18);
    lVar20 = *(long *)(&this->field_0x178 + (long)p_Var18);
    uVar54 = local_2f0 * local_2dc;
    iVar31 = top_blob->elempack;
    uVar30 = top_blob->w;
    if (iVar31 == 1) {
      if (0 < (int)uVar30 >> 3) {
        local_220 = (ulong)(uint)((int)uVar30 >> 3);
        lVar42 = 7;
        lVar38 = 6;
        lVar40 = 5;
        lVar43 = 4;
        lVar45 = 3;
        lVar34 = 2;
        lVar58 = 1;
        local_358 = 0;
        uVar32 = 0;
        do {
          uVar1 = uVar32 * 8;
          auVar287 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar20 != 0) {
            auVar287 = ZEXT3264(*(undefined1 (*) [32])(lVar20 + uVar32 * 0x20));
          }
          auVar271 = auVar287._0_32_;
          lVar33 = (long)(this->weight_data_tm).w;
          pvVar21 = (this->weight_data_tm).data;
          sVar22 = (this->weight_data_tm).elemsize;
          lVar48 = local_308._0_8_;
          if ((int)uVar54 < 8) {
            lVar33 = sVar22 * lVar33;
            lVar35 = lVar33 * uVar1;
            lVar47 = (uVar1 | 1) * lVar33;
            lVar46 = (uVar1 | 2) * lVar33;
            lVar53 = (uVar1 | 3) * lVar33;
            lVar52 = (uVar1 | 4) * lVar33;
            lVar51 = (uVar1 | 5) * lVar33;
            lVar50 = (uVar1 | 6) * lVar33;
            lVar49 = lVar33 * (uVar1 | 7);
            uVar29 = 0;
            local_b8 = SUB6432(ZEXT864(0),0);
            local_d8 = SUB6432(ZEXT864(0),0);
            local_f8 = SUB6432(ZEXT864(0),0);
            local_118 = SUB6432(ZEXT864(0),0);
            local_138 = SUB6432(ZEXT864(0),0);
            local_158 = SUB6432(ZEXT864(0),0);
            local_178 = SUB6432(ZEXT864(0),0);
            local_98 = SUB6432(ZEXT864(0),0);
          }
          else {
            lVar49 = sVar22 * lVar42 * lVar33;
            local_2b8._0_8_ = lVar49;
            lVar50 = sVar22 * lVar38 * lVar33;
            lVar51 = sVar22 * lVar40 * lVar33;
            lVar52 = sVar22 * lVar43 * lVar33;
            lVar53 = sVar22 * lVar45 * lVar33;
            lVar46 = sVar22 * lVar34 * lVar33;
            lVar47 = sVar22 * lVar58 * lVar33;
            lVar33 = sVar22 * local_358 * lVar33;
            auVar127 = ZEXT864(0);
            auVar359 = ZEXT864(0);
            auVar353 = ZEXT864(0);
            auVar334 = ZEXT864(0);
            auVar265 = ZEXT864(0);
            auVar379 = ZEXT864(0);
            auVar210 = ZEXT864(0);
            auVar183 = ZEXT864(0);
            iVar41 = 7;
            lVar35 = 0;
            do {
              auVar91 = *(undefined1 (*) [32])(local_308._0_8_ + lVar35 * 2);
              auVar130 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar35 + lVar33));
              auVar78 = vcvtph2ps_f16c(auVar130);
              auVar130 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar35 + lVar47));
              auVar89 = vcvtph2ps_f16c(auVar130);
              auVar130 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar35 + lVar46));
              auVar126 = vcvtph2ps_f16c(auVar130);
              auVar130 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar35 + lVar53));
              auVar181 = vcvtph2ps_f16c(auVar130);
              auVar130 = vfmadd231ps_fma(auVar127._0_32_,auVar91,auVar78);
              auVar127 = ZEXT1664(auVar130);
              local_98 = ZEXT1632(auVar130);
              auVar130 = vfmadd231ps_fma(auVar359._0_32_,auVar91,auVar89);
              auVar359 = ZEXT1664(auVar130);
              local_178 = ZEXT1632(auVar130);
              auVar130 = vfmadd231ps_fma(auVar353._0_32_,auVar91,auVar126);
              auVar353 = ZEXT1664(auVar130);
              local_158 = ZEXT1632(auVar130);
              auVar130 = vfmadd231ps_fma(auVar334._0_32_,auVar91,auVar181);
              auVar334 = ZEXT1664(auVar130);
              local_138 = ZEXT1632(auVar130);
              auVar130 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar35 + lVar52));
              auVar78 = vcvtph2ps_f16c(auVar130);
              auVar130 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar35 + lVar51));
              auVar89 = vcvtph2ps_f16c(auVar130);
              auVar130 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar35 + lVar50));
              auVar126 = vcvtph2ps_f16c(auVar130);
              auVar130 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar35 + lVar49));
              auVar181 = vcvtph2ps_f16c(auVar130);
              auVar130 = vfmadd231ps_fma(auVar265._0_32_,auVar91,auVar78);
              auVar265 = ZEXT1664(auVar130);
              local_118 = ZEXT1632(auVar130);
              auVar130 = vfmadd231ps_fma(auVar379._0_32_,auVar91,auVar89);
              auVar379 = ZEXT1664(auVar130);
              local_f8 = ZEXT1632(auVar130);
              auVar130 = vfmadd231ps_fma(auVar210._0_32_,auVar91,auVar126);
              auVar210 = ZEXT1664(auVar130);
              local_d8 = ZEXT1632(auVar130);
              auVar130 = vfmadd231ps_fma(auVar183._0_32_,auVar91,auVar181);
              auVar183 = ZEXT1664(auVar130);
              local_b8 = ZEXT1632(auVar130);
              lVar48 = lVar48 + 0x20;
              iVar41 = iVar41 + 8;
              lVar35 = lVar35 + 0x10;
            } while (iVar41 < (int)uVar54);
            lVar49 = lVar49 + lVar35;
            lVar50 = lVar50 + lVar35;
            lVar51 = lVar51 + lVar35;
            lVar52 = lVar52 + lVar35;
            lVar53 = lVar53 + lVar35;
            lVar46 = lVar46 + lVar35;
            lVar47 = lVar47 + lVar35;
            lVar35 = lVar33 + lVar35;
            uVar29 = uVar54 & 0xfffffff8;
          }
          if ((int)uVar29 < (int)uVar54) {
            lVar33 = 0;
            do {
              local_2b8 = auVar287._0_32_;
              uVar44 = *(uint *)(lVar48 + lVar33 * 4);
              fVar95 = float16_to_float32(*(unsigned_short *)((long)pvVar21 + lVar33 * 2 + lVar35));
              auVar271 = _local_218;
              local_218._4_4_ = extraout_XMM0_Db;
              local_218._0_4_ = fVar95;
              fStack_210 = (float)extraout_XMM0_Dc;
              _fStack_208 = auVar271._16_16_;
              fStack_20c = (float)extraout_XMM0_Dd;
              uVar3 = *(uint *)(lVar48 + lVar33 * 4);
              fVar95 = float16_to_float32(*(unsigned_short *)((long)pvVar21 + lVar33 * 2 + lVar47));
              local_238 = CONCAT44(extraout_XMM0_Db_00,fVar95);
              uVar4 = *(uint *)(lVar48 + lVar33 * 4);
              local_248._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar21 + lVar33 * 2 + lVar46));
              local_248._4_4_ = extraout_XMM0_Db_01;
              local_248._8_4_ = extraout_XMM0_Dc_00;
              local_248._12_4_ = extraout_XMM0_Dd_00;
              local_258 = ZEXT416(*(uint *)(lVar48 + lVar33 * 4));
              local_268._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar21 + lVar33 * 2 + lVar53));
              local_268._4_4_ = extraout_XMM0_Db_02;
              local_268._8_4_ = extraout_XMM0_Dc_01;
              local_268._12_4_ = extraout_XMM0_Dd_01;
              local_278 = ZEXT416(*(uint *)(lVar48 + lVar33 * 4));
              local_288 = float16_to_float32(*(unsigned_short *)
                                              ((long)pvVar21 + lVar33 * 2 + lVar52));
              local_198._0_16_ = ZEXT416(*(uint *)(lVar48 + lVar33 * 4));
              uStack_284 = extraout_XMM0_Db_03;
              uStack_280 = extraout_XMM0_Dc_02;
              uStack_27c = extraout_XMM0_Dd_02;
              fVar95 = float16_to_float32(*(unsigned_short *)((long)pvVar21 + lVar33 * 2 + lVar51));
              auVar271 = local_1b8;
              local_1b8._4_4_ = extraout_XMM0_Db_04;
              local_1b8._0_4_ = fVar95;
              local_1b8._8_4_ = extraout_XMM0_Dc_03;
              local_1b8._16_16_ = auVar271._16_16_;
              local_1b8._12_4_ = extraout_XMM0_Dd_03;
              local_1d8._0_16_ = ZEXT416(*(uint *)(lVar48 + lVar33 * 4));
              fVar95 = float16_to_float32(*(unsigned_short *)((long)pvVar21 + lVar33 * 2 + lVar50));
              auVar271 = local_1f8;
              local_1f8._4_4_ = extraout_XMM0_Db_05;
              local_1f8._0_4_ = fVar95;
              local_1f8._8_4_ = extraout_XMM0_Dc_04;
              local_1f8._16_16_ = auVar271._16_16_;
              local_1f8._12_4_ = extraout_XMM0_Dd_04;
              local_298 = ZEXT416(*(uint *)(lVar48 + lVar33 * 4));
              auVar287._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar21 + lVar33 * 2 + lVar49));
              auVar287._4_60_ = extraout_var;
              auVar130._4_4_ = uStack_284;
              auVar130._0_4_ = local_288;
              auVar130._8_4_ = uStack_280;
              auVar130._12_4_ = uStack_27c;
              auVar130 = vinsertps_avx(auVar130,ZEXT416((uint)local_1b8._0_4_),0x10);
              auVar130 = vinsertps_avx(auVar130,ZEXT416((uint)local_1f8._0_4_),0x20);
              auVar130 = vinsertps_avx(auVar130,auVar287._0_16_,0x30);
              auVar185 = vinsertps_avx(_local_218,ZEXT416((uint)local_238),0x10);
              auVar185 = vinsertps_avx(auVar185,ZEXT416((uint)local_248._0_4_),0x20);
              auVar185 = vinsertps_avx(auVar185,ZEXT416((uint)local_268._0_4_),0x30);
              auVar91._16_16_ = auVar130;
              auVar91._0_16_ = auVar185;
              auVar130 = vinsertps_avx(local_278,ZEXT416((uint)local_198._0_4_),0x10);
              auVar130 = vinsertps_avx(auVar130,ZEXT416((uint)local_1d8._0_4_),0x20);
              auVar130 = vinsertps_avx(auVar130,ZEXT416((uint)local_298._0_4_),0x30);
              auVar185 = vinsertps_avx(ZEXT416(uVar44),ZEXT416(uVar3),0x10);
              auVar185 = vinsertps_avx(auVar185,ZEXT416(uVar4),0x20);
              auVar185 = vinsertps_avx(auVar185,ZEXT416((uint)local_258._0_4_),0x30);
              auVar78._16_16_ = auVar130;
              auVar78._0_16_ = auVar185;
              auVar130 = vfmadd231ps_fma(local_2b8,auVar91,auVar78);
              auVar287 = ZEXT1664(auVar130);
              auVar271 = ZEXT1632(auVar130);
              lVar33 = lVar33 + 1;
            } while (uVar54 - uVar29 != (int)lVar33);
          }
          auVar91 = vhaddps_avx(local_98,local_178);
          auVar78 = vhaddps_avx(local_158,local_138);
          auVar78 = vhaddps_avx(auVar91,auVar78);
          auVar91 = vhaddps_avx(local_118,local_f8);
          auVar89 = vhaddps_avx(local_d8,local_b8);
          auVar89 = vhaddps_avx(auVar91,auVar89);
          auVar91 = vblendps_avx(auVar78,auVar89,0xf0);
          auVar78 = vperm2f128_avx(auVar78,auVar89,0x21);
          fVar95 = auVar78._0_4_ + auVar271._0_4_ + auVar91._0_4_;
          fVar128 = auVar78._4_4_ + auVar271._4_4_ + auVar91._4_4_;
          auVar89._0_8_ = CONCAT44(fVar128,fVar95);
          auVar89._8_4_ = auVar78._8_4_ + auVar271._8_4_ + auVar91._8_4_;
          auVar89._12_4_ = auVar78._12_4_ + auVar271._12_4_ + auVar91._12_4_;
          auVar89._16_4_ = auVar78._16_4_ + auVar271._16_4_ + auVar91._16_4_;
          auVar89._20_4_ = auVar78._20_4_ + auVar271._20_4_ + auVar91._20_4_;
          auVar89._24_4_ = auVar78._24_4_ + auVar271._24_4_ + auVar91._24_4_;
          auVar89._28_4_ = auVar78._28_4_ + auVar271._28_4_ + auVar91._28_4_;
          switch(uVar17) {
          case 1:
            auVar89 = vmaxps_avx(auVar89,_DAT_00559600);
            break;
          case 2:
            auVar271 = vmaxps_avx(auVar89,ZEXT832(0) << 0x20);
            auVar91 = vminps_avx(auVar89,ZEXT832(0) << 0x20);
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var18);
            auVar94._4_4_ = uVar2;
            auVar94._0_4_ = uVar2;
            auVar94._8_4_ = uVar2;
            auVar94._12_4_ = uVar2;
            auVar94._16_4_ = uVar2;
            auVar94._20_4_ = uVar2;
            auVar94._24_4_ = uVar2;
            auVar94._28_4_ = uVar2;
            auVar130 = vfmadd213ps_fma(auVar94,auVar91,auVar271);
            auVar89 = ZEXT1632(auVar130);
            break;
          case 3:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var18);
            auVar121._4_4_ = uVar2;
            auVar121._0_4_ = uVar2;
            auVar121._8_4_ = uVar2;
            auVar121._12_4_ = uVar2;
            auVar121._16_4_ = uVar2;
            auVar121._20_4_ = uVar2;
            auVar121._24_4_ = uVar2;
            auVar121._28_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var18))[1];
            auVar178._4_4_ = uVar2;
            auVar178._0_4_ = uVar2;
            auVar178._8_4_ = uVar2;
            auVar178._12_4_ = uVar2;
            auVar178._16_4_ = uVar2;
            auVar178._20_4_ = uVar2;
            auVar178._24_4_ = uVar2;
            auVar178._28_4_ = uVar2;
            auVar271 = vmaxps_avx(auVar89,auVar121);
            auVar89 = vminps_avx(auVar271,auVar178);
            break;
          case 4:
            auVar90._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
            auVar90._8_4_ = -auVar89._8_4_;
            auVar90._12_4_ = -auVar89._12_4_;
            auVar90._16_4_ = -auVar89._16_4_;
            auVar90._20_4_ = -auVar89._20_4_;
            auVar90._24_4_ = -auVar89._24_4_;
            auVar90._28_4_ = -auVar89._28_4_;
            auVar122._8_4_ = 0x42b0c0a5;
            auVar122._0_8_ = 0x42b0c0a542b0c0a5;
            auVar122._12_4_ = 0x42b0c0a5;
            auVar122._16_4_ = 0x42b0c0a5;
            auVar122._20_4_ = 0x42b0c0a5;
            auVar122._24_4_ = 0x42b0c0a5;
            auVar122._28_4_ = 0x42b0c0a5;
            auVar271 = vminps_avx(auVar90,auVar122);
            auVar123._8_4_ = 0xc2b0c0a5;
            auVar123._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar123._12_4_ = 0xc2b0c0a5;
            auVar123._16_4_ = 0xc2b0c0a5;
            auVar123._20_4_ = 0xc2b0c0a5;
            auVar123._24_4_ = 0xc2b0c0a5;
            auVar123._28_4_ = 0xc2b0c0a5;
            auVar91 = vmaxps_avx(auVar271,auVar123);
            auVar124._8_4_ = 0x3fb8aa3b;
            auVar124._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar124._12_4_ = 0x3fb8aa3b;
            auVar124._16_4_ = 0x3fb8aa3b;
            auVar124._20_4_ = 0x3fb8aa3b;
            auVar124._24_4_ = 0x3fb8aa3b;
            auVar124._28_4_ = 0x3fb8aa3b;
            auVar241._8_4_ = 0x3f000000;
            auVar241._0_8_ = 0x3f0000003f000000;
            auVar241._12_4_ = 0x3f000000;
            auVar241._16_4_ = 0x3f000000;
            auVar241._20_4_ = 0x3f000000;
            auVar241._24_4_ = 0x3f000000;
            auVar241._28_4_ = 0x3f000000;
            auVar130 = vfmadd213ps_fma(auVar124,auVar91,auVar241);
            auVar78 = vroundps_avx(ZEXT1632(auVar130),1);
            auVar271 = vcmpps_avx(ZEXT1632(auVar130),auVar78,1);
            auVar264._8_4_ = 0x3f800000;
            auVar264._0_8_ = 0x3f8000003f800000;
            auVar264._12_4_ = 0x3f800000;
            auVar264._16_4_ = 0x3f800000;
            auVar264._20_4_ = 0x3f800000;
            auVar264._24_4_ = 0x3f800000;
            auVar264._28_4_ = 0x3f800000;
            auVar271 = vandps_avx(auVar271,auVar264);
            auVar271 = vsubps_avx(auVar78,auVar271);
            auVar179._8_4_ = 0x3f318000;
            auVar179._0_8_ = 0x3f3180003f318000;
            auVar179._12_4_ = 0x3f318000;
            auVar179._16_4_ = 0x3f318000;
            auVar179._20_4_ = 0x3f318000;
            auVar179._24_4_ = 0x3f318000;
            auVar179._28_4_ = 0x3f318000;
            auVar130 = vfmsub231ps_fma(auVar91,auVar271,auVar179);
            auVar180._8_4_ = 0x395e8083;
            auVar180._0_8_ = 0x395e8083395e8083;
            auVar180._12_4_ = 0x395e8083;
            auVar180._16_4_ = 0x395e8083;
            auVar180._20_4_ = 0x395e8083;
            auVar180._24_4_ = 0x395e8083;
            auVar180._28_4_ = 0x395e8083;
            auVar185 = vfmsub231ps_fma(ZEXT1632(auVar130),auVar271,auVar180);
            auVar91 = ZEXT1632(auVar185);
            auVar28._28_4_ = 0x395e8083;
            auVar28._0_28_ =
                 ZEXT1628(CONCAT412(auVar185._12_4_ * auVar185._12_4_,
                                    CONCAT48(auVar185._8_4_ * auVar185._8_4_,
                                             CONCAT44(auVar185._4_4_ * auVar185._4_4_,
                                                      auVar185._0_4_ * auVar185._0_4_))));
            auVar209._8_4_ = 0x39506967;
            auVar209._0_8_ = 0x3950696739506967;
            auVar209._12_4_ = 0x39506967;
            auVar209._16_4_ = 0x39506967;
            auVar209._20_4_ = 0x39506967;
            auVar209._24_4_ = 0x39506967;
            auVar209._28_4_ = 0x39506967;
            auVar283._8_4_ = 0x3ab743ce;
            auVar283._0_8_ = 0x3ab743ce3ab743ce;
            auVar283._12_4_ = 0x3ab743ce;
            auVar283._16_4_ = 0x3ab743ce;
            auVar283._20_4_ = 0x3ab743ce;
            auVar283._24_4_ = 0x3ab743ce;
            auVar283._28_4_ = 0x3ab743ce;
            auVar130 = vfmadd213ps_fma(auVar209,auVar91,auVar283);
            auVar284._8_4_ = 0x3c088908;
            auVar284._0_8_ = 0x3c0889083c088908;
            auVar284._12_4_ = 0x3c088908;
            auVar284._16_4_ = 0x3c088908;
            auVar284._20_4_ = 0x3c088908;
            auVar284._24_4_ = 0x3c088908;
            auVar284._28_4_ = 0x3c088908;
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar91,auVar284);
            auVar285._8_4_ = 0x3d2aa9c1;
            auVar285._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar285._12_4_ = 0x3d2aa9c1;
            auVar285._16_4_ = 0x3d2aa9c1;
            auVar285._20_4_ = 0x3d2aa9c1;
            auVar285._24_4_ = 0x3d2aa9c1;
            auVar285._28_4_ = 0x3d2aa9c1;
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar91,auVar285);
            auVar286._8_4_ = 0x3e2aaaaa;
            auVar286._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar286._12_4_ = 0x3e2aaaaa;
            auVar286._16_4_ = 0x3e2aaaaa;
            auVar286._20_4_ = 0x3e2aaaaa;
            auVar286._24_4_ = 0x3e2aaaaa;
            auVar286._28_4_ = 0x3e2aaaaa;
            auVar91 = ZEXT1632(auVar185);
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar91,auVar286);
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar91,auVar241);
            auVar214 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar28,auVar91);
            auVar68._0_4_ = (int)auVar271._0_4_;
            auVar68._4_4_ = (int)auVar271._4_4_;
            auVar68._8_4_ = (int)auVar271._8_4_;
            auVar68._12_4_ = (int)auVar271._12_4_;
            auVar92._16_4_ = (int)auVar271._16_4_;
            auVar92._0_16_ = auVar68;
            auVar92._20_4_ = (int)auVar271._20_4_;
            auVar92._24_4_ = (int)auVar271._24_4_;
            auVar92._28_4_ = (int)auVar271._28_4_;
            auVar185 = vpslld_avx(auVar68,0x17);
            auVar130 = vpslld_avx(auVar92._16_16_,0x17);
            auVar139._8_4_ = 0x3f800000;
            auVar139._0_8_ = 0x3f8000003f800000;
            auVar139._12_4_ = 0x3f800000;
            auVar130 = vpaddd_avx(auVar130,auVar139);
            auVar185 = vpaddd_avx(auVar185,auVar139);
            auVar93._16_16_ = auVar130;
            auVar93._0_16_ = auVar185;
            auVar125._0_4_ = auVar214._0_4_ + 1.0;
            auVar125._4_4_ = auVar214._4_4_ + 1.0;
            auVar125._8_4_ = auVar214._8_4_ + 1.0;
            auVar125._12_4_ = auVar214._12_4_ + 1.0;
            auVar125._16_4_ = 0x3f800000;
            auVar125._20_4_ = 0x3f800000;
            auVar125._24_4_ = 0x3f800000;
            auVar125._28_4_ = 0x3f800000;
            auVar130 = vfmadd213ps_fma(auVar93,auVar125,auVar264);
            auVar271 = vrcpps_avx(ZEXT1632(auVar130));
            auVar130 = vfmsub213ps_fma(ZEXT1632(auVar130),auVar271,auVar264);
            auVar130 = vfnmadd132ps_fma(ZEXT1632(auVar130),auVar271,auVar271);
            auVar89 = ZEXT1632(auVar130);
            break;
          case 5:
            auVar305._8_4_ = 0x42b0c0a5;
            auVar305._0_8_ = 0x42b0c0a542b0c0a5;
            auVar305._12_4_ = 0x42b0c0a5;
            auVar305._16_4_ = 0x42b0c0a5;
            auVar305._20_4_ = 0x42b0c0a5;
            auVar305._24_4_ = 0x42b0c0a5;
            auVar305._28_4_ = 0x42b0c0a5;
            auVar271 = vminps_avx(auVar89,auVar305);
            auVar316._8_4_ = 0xc2b0c0a5;
            auVar316._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar316._12_4_ = 0xc2b0c0a5;
            auVar316._16_4_ = 0xc2b0c0a5;
            auVar316._20_4_ = 0xc2b0c0a5;
            auVar316._24_4_ = 0xc2b0c0a5;
            auVar316._28_4_ = 0xc2b0c0a5;
            auVar91 = vmaxps_avx(auVar316,auVar271);
            auVar170._8_4_ = 0x3fb8aa3b;
            auVar170._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar170._12_4_ = 0x3fb8aa3b;
            auVar170._16_4_ = 0x3fb8aa3b;
            auVar170._20_4_ = 0x3fb8aa3b;
            auVar170._24_4_ = 0x3fb8aa3b;
            auVar170._28_4_ = 0x3fb8aa3b;
            auVar333._8_4_ = 0x3f000000;
            auVar333._0_8_ = 0x3f0000003f000000;
            auVar333._12_4_ = 0x3f000000;
            auVar333._16_4_ = 0x3f000000;
            auVar333._20_4_ = 0x3f000000;
            auVar333._24_4_ = 0x3f000000;
            auVar333._28_4_ = 0x3f000000;
            auVar130 = vfmadd213ps_fma(auVar170,auVar91,auVar333);
            auVar78 = vroundps_avx(ZEXT1632(auVar130),1);
            auVar271 = vcmpps_avx(ZEXT1632(auVar130),auVar78,1);
            auVar352._8_4_ = 0x3f800000;
            auVar352._0_8_ = 0x3f8000003f800000;
            auVar352._12_4_ = 0x3f800000;
            auVar352._16_4_ = 0x3f800000;
            auVar352._20_4_ = 0x3f800000;
            auVar352._24_4_ = 0x3f800000;
            auVar352._28_4_ = 0x3f800000;
            auVar271 = vandps_avx(auVar352,auVar271);
            auVar271 = vsubps_avx(auVar78,auVar271);
            auVar358._8_4_ = 0x3f318000;
            auVar358._0_8_ = 0x3f3180003f318000;
            auVar358._12_4_ = 0x3f318000;
            auVar358._16_4_ = 0x3f318000;
            auVar358._20_4_ = 0x3f318000;
            auVar358._24_4_ = 0x3f318000;
            auVar358._28_4_ = 0x3f318000;
            auVar130 = vfmsub231ps_fma(auVar91,auVar271,auVar358);
            auVar317._8_4_ = 0xb95e8083;
            auVar317._0_8_ = 0xb95e8083b95e8083;
            auVar317._12_4_ = 0xb95e8083;
            auVar317._16_4_ = 0xb95e8083;
            auVar317._20_4_ = 0xb95e8083;
            auVar317._24_4_ = 0xb95e8083;
            auVar317._28_4_ = 0xb95e8083;
            auVar185 = vfnmsub231ps_fma(ZEXT1632(auVar130),auVar271,auVar317);
            auVar91 = ZEXT1632(auVar185);
            auVar110._28_4_ = auVar78._28_4_;
            auVar110._0_28_ =
                 ZEXT1628(CONCAT412(auVar185._12_4_ * auVar185._12_4_,
                                    CONCAT48(auVar185._8_4_ * auVar185._8_4_,
                                             CONCAT44(auVar185._4_4_ * auVar185._4_4_,
                                                      auVar185._0_4_ * auVar185._0_4_))));
            auVar372._8_4_ = 0x39506967;
            auVar372._0_8_ = 0x3950696739506967;
            auVar372._12_4_ = 0x39506967;
            auVar372._16_4_ = 0x39506967;
            auVar372._20_4_ = 0x39506967;
            auVar372._24_4_ = 0x39506967;
            auVar372._28_4_ = 0x39506967;
            auVar364._8_4_ = 0x3ab743ce;
            auVar364._0_8_ = 0x3ab743ce3ab743ce;
            auVar364._12_4_ = 0x3ab743ce;
            auVar364._16_4_ = 0x3ab743ce;
            auVar364._20_4_ = 0x3ab743ce;
            auVar364._24_4_ = 0x3ab743ce;
            auVar364._28_4_ = 0x3ab743ce;
            auVar130 = vfmadd213ps_fma(auVar372,auVar91,auVar364);
            auVar378._8_4_ = 0x3c088908;
            auVar378._0_8_ = 0x3c0889083c088908;
            auVar378._12_4_ = 0x3c088908;
            auVar378._16_4_ = 0x3c088908;
            auVar378._20_4_ = 0x3c088908;
            auVar378._24_4_ = 0x3c088908;
            auVar378._28_4_ = 0x3c088908;
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar91,auVar378);
            auVar257._8_4_ = 0x3d2aa9c1;
            auVar257._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar257._12_4_ = 0x3d2aa9c1;
            auVar257._16_4_ = 0x3d2aa9c1;
            auVar257._20_4_ = 0x3d2aa9c1;
            auVar257._24_4_ = 0x3d2aa9c1;
            auVar257._28_4_ = 0x3d2aa9c1;
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar91,auVar257);
            auVar258._8_4_ = 0x3e2aaaaa;
            auVar258._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar258._12_4_ = 0x3e2aaaaa;
            auVar258._16_4_ = 0x3e2aaaaa;
            auVar258._20_4_ = 0x3e2aaaaa;
            auVar258._24_4_ = 0x3e2aaaaa;
            auVar258._28_4_ = 0x3e2aaaaa;
            auVar91 = ZEXT1632(auVar185);
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar91,auVar258);
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar91,auVar333);
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar110,auVar91);
            auVar206._0_4_ = auVar130._0_4_ + 1.0;
            auVar206._4_4_ = auVar130._4_4_ + 1.0;
            auVar206._8_4_ = auVar130._8_4_ + 1.0;
            auVar206._12_4_ = auVar130._12_4_ + 1.0;
            auVar206._16_4_ = 0x3f800000;
            auVar206._20_4_ = 0x3f800000;
            auVar206._24_4_ = 0x3f800000;
            auVar206._28_4_ = 0x3f800000;
            auVar185._0_4_ = (int)auVar271._0_4_;
            auVar185._4_4_ = (int)auVar271._4_4_;
            auVar185._8_4_ = (int)auVar271._8_4_;
            auVar185._12_4_ = (int)auVar271._12_4_;
            auVar117._16_4_ = (int)auVar271._16_4_;
            auVar117._0_16_ = auVar185;
            auVar117._20_4_ = (int)auVar271._20_4_;
            auVar117._24_4_ = (int)auVar271._24_4_;
            auVar117._28_4_ = (int)auVar271._28_4_;
            auVar185 = vpslld_avx(auVar185,0x17);
            auVar130 = vpslld_avx(auVar117._16_16_,0x17);
            auVar290._8_4_ = 0x3f800000;
            auVar290._0_8_ = 0x3f8000003f800000;
            auVar290._12_4_ = 0x3f800000;
            auVar130 = vpaddd_avx(auVar130,auVar290);
            auVar185 = vpaddd_avx(auVar185,auVar290);
            auVar118._16_16_ = auVar130;
            auVar118._0_16_ = auVar185;
            auVar214 = vfmadd213ps_fma(auVar118,auVar206,auVar352);
            auVar171._8_4_ = 0x800000;
            auVar171._0_8_ = 0x80000000800000;
            auVar171._12_4_ = 0x800000;
            auVar171._16_4_ = 0x800000;
            auVar171._20_4_ = 0x800000;
            auVar171._24_4_ = 0x800000;
            auVar171._28_4_ = 0x800000;
            auVar271 = vmaxps_avx(ZEXT1632(auVar214),auVar171);
            auVar185 = vpsrld_avx(auVar271._0_16_,0x17);
            auVar130 = vpsrld_avx(auVar271._16_16_,0x17);
            auVar259._8_4_ = 0x807fffff;
            auVar259._0_8_ = 0x807fffff807fffff;
            auVar259._12_4_ = 0x807fffff;
            auVar259._16_4_ = 0x807fffff;
            auVar259._20_4_ = 0x807fffff;
            auVar259._24_4_ = 0x807fffff;
            auVar259._28_4_ = 0x807fffff;
            auVar271 = vandps_avx(auVar271,auVar259);
            auVar78 = vorps_avx(auVar333,auVar271);
            auVar260._8_4_ = 0x3f3504f3;
            auVar260._0_8_ = 0x3f3504f33f3504f3;
            auVar260._12_4_ = 0x3f3504f3;
            auVar260._16_4_ = 0x3f3504f3;
            auVar260._20_4_ = 0x3f3504f3;
            auVar260._24_4_ = 0x3f3504f3;
            auVar260._28_4_ = 0x3f3504f3;
            auVar91 = vcmpps_avx(auVar260,auVar78,2);
            auVar271 = vandnps_avx(auVar91,auVar78);
            auVar346._8_4_ = 0xbf800000;
            auVar346._0_8_ = 0xbf800000bf800000;
            auVar346._12_4_ = 0xbf800000;
            auVar346._16_4_ = 0xbf800000;
            auVar346._20_4_ = 0xbf800000;
            auVar346._24_4_ = 0xbf800000;
            auVar346._28_4_ = 0xbf800000;
            auVar172._0_4_ = auVar78._0_4_ + -1.0 + auVar271._0_4_;
            auVar172._4_4_ = auVar78._4_4_ + -1.0 + auVar271._4_4_;
            auVar172._8_4_ = auVar78._8_4_ + -1.0 + auVar271._8_4_;
            auVar172._12_4_ = auVar78._12_4_ + -1.0 + auVar271._12_4_;
            auVar172._16_4_ = auVar78._16_4_ + -1.0 + auVar271._16_4_;
            auVar172._20_4_ = auVar78._20_4_ + -1.0 + auVar271._20_4_;
            auVar172._24_4_ = auVar78._24_4_ + -1.0 + auVar271._24_4_;
            auVar172._28_4_ = auVar78._28_4_ + -1.0 + auVar271._28_4_;
            auVar130 = vpsubd_avx(auVar130,auVar91._16_16_);
            auVar267._8_4_ = 0xffffff81;
            auVar267._0_8_ = 0xffffff81ffffff81;
            auVar267._12_4_ = 0xffffff81;
            auVar130 = vpaddd_avx(auVar130,auVar267);
            auVar185 = vpsubd_avx(auVar185,auVar91._0_16_);
            auVar185 = vpaddd_avx(auVar185,auVar267);
            auVar207._16_16_ = auVar130;
            auVar207._0_16_ = auVar185;
            auVar240._0_4_ = auVar172._0_4_ * auVar172._0_4_;
            auVar240._4_4_ = auVar172._4_4_ * auVar172._4_4_;
            auVar240._8_4_ = auVar172._8_4_ * auVar172._8_4_;
            auVar240._12_4_ = auVar172._12_4_ * auVar172._12_4_;
            auVar240._16_4_ = auVar172._16_4_ * auVar172._16_4_;
            auVar240._20_4_ = auVar172._20_4_ * auVar172._20_4_;
            auVar240._24_4_ = auVar172._24_4_ * auVar172._24_4_;
            auVar240._28_4_ = 0;
            auVar261._8_4_ = 0x3d9021bb;
            auVar261._0_8_ = 0x3d9021bb3d9021bb;
            auVar261._12_4_ = 0x3d9021bb;
            auVar261._16_4_ = 0x3d9021bb;
            auVar261._20_4_ = 0x3d9021bb;
            auVar261._24_4_ = 0x3d9021bb;
            auVar261._28_4_ = 0x3d9021bb;
            auVar273._8_4_ = 0xbdebd1b8;
            auVar273._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar273._12_4_ = 0xbdebd1b8;
            auVar273._16_4_ = 0xbdebd1b8;
            auVar273._20_4_ = 0xbdebd1b8;
            auVar273._24_4_ = 0xbdebd1b8;
            auVar273._28_4_ = 0xbdebd1b8;
            auVar130 = vfmadd213ps_fma(auVar261,auVar172,auVar273);
            auVar274._8_4_ = 0x3def251a;
            auVar274._0_8_ = 0x3def251a3def251a;
            auVar274._12_4_ = 0x3def251a;
            auVar274._16_4_ = 0x3def251a;
            auVar274._20_4_ = 0x3def251a;
            auVar274._24_4_ = 0x3def251a;
            auVar274._28_4_ = 0x3def251a;
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar172,auVar274);
            auVar275._8_4_ = 0xbdfe5d4f;
            auVar275._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar275._12_4_ = 0xbdfe5d4f;
            auVar275._16_4_ = 0xbdfe5d4f;
            auVar275._20_4_ = 0xbdfe5d4f;
            auVar275._24_4_ = 0xbdfe5d4f;
            auVar275._28_4_ = 0xbdfe5d4f;
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar172,auVar275);
            auVar276._8_4_ = 0x3e11e9bf;
            auVar276._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar276._12_4_ = 0x3e11e9bf;
            auVar276._16_4_ = 0x3e11e9bf;
            auVar276._20_4_ = 0x3e11e9bf;
            auVar276._24_4_ = 0x3e11e9bf;
            auVar276._28_4_ = 0x3e11e9bf;
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar172,auVar276);
            auVar277._8_4_ = 0xbe2aae50;
            auVar277._0_8_ = 0xbe2aae50be2aae50;
            auVar277._12_4_ = 0xbe2aae50;
            auVar277._16_4_ = 0xbe2aae50;
            auVar277._20_4_ = 0xbe2aae50;
            auVar277._24_4_ = 0xbe2aae50;
            auVar277._28_4_ = 0xbe2aae50;
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar172,auVar277);
            auVar278._8_4_ = 0x3e4cceac;
            auVar278._0_8_ = 0x3e4cceac3e4cceac;
            auVar278._12_4_ = 0x3e4cceac;
            auVar278._16_4_ = 0x3e4cceac;
            auVar278._20_4_ = 0x3e4cceac;
            auVar278._24_4_ = 0x3e4cceac;
            auVar278._28_4_ = 0x3e4cceac;
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar172,auVar278);
            auVar279._8_4_ = 0xbe7ffffc;
            auVar279._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar279._12_4_ = 0xbe7ffffc;
            auVar279._16_4_ = 0xbe7ffffc;
            auVar279._20_4_ = 0xbe7ffffc;
            auVar279._24_4_ = 0xbe7ffffc;
            auVar279._28_4_ = 0xbe7ffffc;
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar172,auVar279);
            auVar280._8_4_ = 0x3eaaaaaa;
            auVar280._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar280._12_4_ = 0x3eaaaaaa;
            auVar280._16_4_ = 0x3eaaaaaa;
            auVar280._20_4_ = 0x3eaaaaaa;
            auVar280._24_4_ = 0x3eaaaaaa;
            auVar280._28_4_ = 0x3eaaaaaa;
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar172,auVar280);
            auVar262._0_4_ = auVar240._0_4_ * auVar172._0_4_ * auVar130._0_4_;
            auVar262._4_4_ = auVar240._4_4_ * auVar172._4_4_ * auVar130._4_4_;
            auVar262._8_4_ = auVar240._8_4_ * auVar172._8_4_ * auVar130._8_4_;
            auVar262._12_4_ = auVar240._12_4_ * auVar172._12_4_ * auVar130._12_4_;
            auVar262._16_4_ = auVar240._16_4_ * auVar172._16_4_ * 0.0;
            auVar262._20_4_ = auVar240._20_4_ * auVar172._20_4_ * 0.0;
            auVar262._24_4_ = auVar240._24_4_ * auVar172._24_4_ * 0.0;
            auVar262._28_4_ = 0;
            auVar91 = vcvtdq2ps_avx(auVar207);
            auVar130 = vfmadd231ps_fma(auVar262,auVar91,auVar317);
            auVar130 = vfmsub231ps_fma(ZEXT1632(auVar130),auVar333,auVar240);
            auVar271 = vcmpps_avx(ZEXT1632(auVar214),_DAT_00559600,2);
            auVar78 = vsubps_avx(ZEXT1632(auVar130),auVar172);
            auVar130 = vfmsub231ps_fma(auVar78,auVar358,auVar91);
            auVar263._8_4_ = 0xc0000000;
            auVar263._0_8_ = 0xc0000000c0000000;
            auVar263._12_4_ = 0xc0000000;
            auVar263._16_4_ = 0xc0000000;
            auVar263._20_4_ = 0xc0000000;
            auVar263._24_4_ = 0xc0000000;
            auVar263._28_4_ = 0xc0000000;
            auVar173._0_4_ = auVar130._0_4_ * -2.0;
            auVar173._4_4_ = auVar130._4_4_ * -2.0;
            auVar173._8_4_ = auVar130._8_4_ * -2.0;
            auVar173._12_4_ = auVar130._12_4_ * -2.0;
            auVar173._16_4_ = 0x80000000;
            auVar173._20_4_ = 0x80000000;
            auVar173._24_4_ = 0x80000000;
            auVar173._28_4_ = 0;
            auVar208._8_4_ = 0x7fffffff;
            auVar208._0_8_ = 0x7fffffff7fffffff;
            auVar208._12_4_ = 0x7fffffff;
            auVar208._16_4_ = 0x7fffffff;
            auVar208._20_4_ = 0x7fffffff;
            auVar208._24_4_ = 0x7fffffff;
            auVar208._28_4_ = 0x7fffffff;
            auVar271 = vblendvps_avx(auVar173,auVar208,auVar271);
            auVar174._8_4_ = 0x42b0c0a5;
            auVar174._0_8_ = 0x42b0c0a542b0c0a5;
            auVar174._12_4_ = 0x42b0c0a5;
            auVar174._16_4_ = 0x42b0c0a5;
            auVar174._20_4_ = 0x42b0c0a5;
            auVar174._24_4_ = 0x42b0c0a5;
            auVar174._28_4_ = 0x42b0c0a5;
            auVar271 = vminps_avx(auVar271,auVar174);
            auVar175._8_4_ = 0xc2b0c0a5;
            auVar175._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar175._12_4_ = 0xc2b0c0a5;
            auVar175._16_4_ = 0xc2b0c0a5;
            auVar175._20_4_ = 0xc2b0c0a5;
            auVar175._24_4_ = 0xc2b0c0a5;
            auVar175._28_4_ = 0xc2b0c0a5;
            auVar91 = vmaxps_avx(auVar271,auVar175);
            auVar176._8_4_ = 0x3fb8aa3b;
            auVar176._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar176._12_4_ = 0x3fb8aa3b;
            auVar176._16_4_ = 0x3fb8aa3b;
            auVar176._20_4_ = 0x3fb8aa3b;
            auVar176._24_4_ = 0x3fb8aa3b;
            auVar176._28_4_ = 0x3fb8aa3b;
            auVar130 = vfmadd213ps_fma(auVar176,auVar91,auVar333);
            auVar78 = vroundps_avx(ZEXT1632(auVar130),1);
            auVar271 = vcmpps_avx(ZEXT1632(auVar130),auVar78,1);
            auVar271 = vandps_avx(auVar352,auVar271);
            auVar271 = vsubps_avx(auVar78,auVar271);
            auVar130 = vfmsub231ps_fma(auVar91,auVar271,auVar358);
            auVar185 = vfnmsub231ps_fma(ZEXT1632(auVar130),auVar271,auVar317);
            auVar91 = ZEXT1632(auVar185);
            auVar23._28_4_ = auVar78._28_4_;
            auVar23._0_28_ =
                 ZEXT1628(CONCAT412(auVar185._12_4_ * auVar185._12_4_,
                                    CONCAT48(auVar185._8_4_ * auVar185._8_4_,
                                             CONCAT44(auVar185._4_4_ * auVar185._4_4_,
                                                      auVar185._0_4_ * auVar185._0_4_))));
            auVar130 = vfmadd213ps_fma(auVar372,auVar91,auVar364);
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar91,auVar378);
            auVar281._8_4_ = 0x3d2aa9c1;
            auVar281._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar281._12_4_ = 0x3d2aa9c1;
            auVar281._16_4_ = 0x3d2aa9c1;
            auVar281._20_4_ = 0x3d2aa9c1;
            auVar281._24_4_ = 0x3d2aa9c1;
            auVar281._28_4_ = 0x3d2aa9c1;
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar91,auVar281);
            auVar282._8_4_ = 0x3e2aaaaa;
            auVar282._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar282._12_4_ = 0x3e2aaaaa;
            auVar282._16_4_ = 0x3e2aaaaa;
            auVar282._20_4_ = 0x3e2aaaaa;
            auVar282._24_4_ = 0x3e2aaaaa;
            auVar282._28_4_ = 0x3e2aaaaa;
            auVar91 = ZEXT1632(auVar185);
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar91,auVar282);
            auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar91,auVar333);
            auVar214 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar23,auVar91);
            auVar367._0_4_ = (int)auVar271._0_4_;
            auVar367._4_4_ = (int)auVar271._4_4_;
            auVar367._8_4_ = (int)auVar271._8_4_;
            auVar367._12_4_ = (int)auVar271._12_4_;
            auVar119._16_4_ = (int)auVar271._16_4_;
            auVar119._0_16_ = auVar367;
            auVar119._20_4_ = (int)auVar271._20_4_;
            auVar119._24_4_ = (int)auVar271._24_4_;
            auVar119._28_4_ = (int)auVar271._28_4_;
            auVar185 = vpslld_avx(auVar367,0x17);
            auVar130 = vpslld_avx(auVar119._16_16_,0x17);
            auVar130 = vpaddd_avx(auVar130,auVar290);
            auVar185 = vpaddd_avx(auVar185,auVar290);
            auVar120._16_16_ = auVar130;
            auVar120._0_16_ = auVar185;
            auVar177._0_4_ = auVar214._0_4_ + 1.0;
            auVar177._4_4_ = auVar214._4_4_ + 1.0;
            auVar177._8_4_ = auVar214._8_4_ + 1.0;
            auVar177._12_4_ = auVar214._12_4_ + 1.0;
            auVar177._16_4_ = 0x3f800000;
            auVar177._20_4_ = 0x3f800000;
            auVar177._24_4_ = 0x3f800000;
            auVar177._28_4_ = 0x3f800000;
            auVar130 = vfmadd213ps_fma(auVar120,auVar177,auVar352);
            auVar271 = vrcpps_avx(ZEXT1632(auVar130));
            auVar130 = vfmsub213ps_fma(ZEXT1632(auVar130),auVar271,auVar352);
            auVar130 = vfnmadd132ps_fma(ZEXT1632(auVar130),auVar271,auVar271);
            auVar130 = vfnmadd213ps_fma(ZEXT1632(auVar130),auVar263,auVar346);
            auVar74 = ZEXT1628(auVar130);
            goto LAB_002d70c6;
          case 6:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var18);
            auVar126._4_4_ = uVar2;
            auVar126._0_4_ = uVar2;
            auVar126._8_4_ = uVar2;
            auVar126._12_4_ = uVar2;
            auVar126._16_4_ = uVar2;
            auVar126._20_4_ = uVar2;
            auVar126._24_4_ = uVar2;
            auVar126._28_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var18))[1];
            auVar181._4_4_ = uVar2;
            auVar181._0_4_ = uVar2;
            auVar181._8_4_ = uVar2;
            auVar181._12_4_ = uVar2;
            auVar181._16_4_ = uVar2;
            auVar181._20_4_ = uVar2;
            auVar181._24_4_ = uVar2;
            auVar181._28_4_ = uVar2;
            auVar130 = vfmadd231ps_fma(auVar181,auVar89,auVar126);
            auVar271 = vmaxps_avx(ZEXT1632(auVar130),_DAT_00559600);
            auVar182._8_4_ = 0x3f800000;
            auVar182._0_8_ = 0x3f8000003f800000;
            auVar182._12_4_ = 0x3f800000;
            auVar182._16_4_ = 0x3f800000;
            auVar182._20_4_ = 0x3f800000;
            auVar182._24_4_ = 0x3f800000;
            auVar182._28_4_ = 0x3f800000;
            auVar271 = vminps_avx(auVar271,auVar182);
            auVar74 = auVar271._0_28_;
LAB_002d70c6:
            auVar89._4_4_ = auVar74._4_4_ * fVar128;
            auVar89._0_4_ = auVar74._0_4_ * fVar95;
            auVar89._8_4_ = auVar74._8_4_ * auVar89._8_4_;
            auVar89._12_4_ = auVar74._12_4_ * auVar89._12_4_;
            auVar89._16_4_ = auVar74._16_4_ * auVar89._16_4_;
            auVar89._20_4_ = auVar74._20_4_ * auVar89._20_4_;
            auVar89._24_4_ = auVar74._24_4_ * auVar89._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + uVar32 * 0x20) = auVar89;
          uVar32 = uVar32 + 1;
          lVar42 = lVar42 + 8;
          lVar38 = lVar38 + 8;
          lVar40 = lVar40 + 8;
          lVar43 = lVar43 + 8;
          lVar45 = lVar45 + 8;
          lVar34 = lVar34 + 8;
          lVar58 = lVar58 + 8;
          local_358 = local_358 + 8;
        } while (uVar32 != local_220);
      }
      auVar130 = local_278;
      local_238 = (ulong)(int)uVar30;
      uVar32 = local_238 & 0xfffffffffffffff8;
      fVar95 = (float)(uVar30 >> 2 & 1);
      if ((uVar30 >> 2 & 1) != 0) {
        uStack_284 = 0;
        if (lVar20 == 0) {
          auVar185 = ZEXT816(0) << 0x40;
        }
        else {
          auVar185 = *(undefined1 (*) [16])(lVar20 + uVar32 * 4);
        }
        lVar42 = (long)(this->weight_data_tm).w * (this->weight_data_tm).elemsize;
        pvVar21 = (this->weight_data_tm).data;
        pauVar36 = (undefined1 (*) [16])(lVar42 * uVar32 + (long)pvVar21);
        pauVar59 = (undefined1 (*) [16])((uVar32 | 1) * lVar42 + (long)pvVar21);
        pauVar55 = (undefined1 (*) [16])((uVar32 | 2) * lVar42 + (long)pvVar21);
        pauVar56 = (undefined1 (*) [16])(lVar42 * (uVar32 | 3) + (long)pvVar21);
        pauVar37 = (undefined1 (*) [32])local_308._0_8_;
        if ((int)uVar54 < 8) {
          uVar29 = 0;
          local_1b8 = SUB6432(ZEXT864(0),0);
          local_1f8 = SUB6432(ZEXT864(0),0);
          local_1d8 = SUB6432(ZEXT864(0),0);
          local_198 = SUB6432(ZEXT864(0),0);
        }
        else {
          uVar29 = uVar54 & 0xfffffff8;
          auVar287 = ZEXT864(0);
          iVar41 = 7;
          auVar183 = ZEXT864(0);
          auVar210 = ZEXT864(0);
          auVar127 = ZEXT864(0);
          do {
            auVar271 = *pauVar37;
            auVar214 = vlddqu_avx(*pauVar36);
            auVar91 = vcvtph2ps_f16c(auVar214);
            auVar214 = vlddqu_avx(*pauVar59);
            auVar78 = vcvtph2ps_f16c(auVar214);
            auVar214 = vlddqu_avx(*pauVar55);
            auVar89 = vcvtph2ps_f16c(auVar214);
            auVar214 = vlddqu_avx(*pauVar56);
            auVar126 = vcvtph2ps_f16c(auVar214);
            auVar214 = vfmadd231ps_fma(auVar127._0_32_,auVar271,auVar91);
            auVar127 = ZEXT1664(auVar214);
            local_1b8 = ZEXT1632(auVar214);
            auVar214 = vfmadd231ps_fma(auVar210._0_32_,auVar271,auVar78);
            auVar210 = ZEXT1664(auVar214);
            local_1f8 = ZEXT1632(auVar214);
            auVar214 = vfmadd231ps_fma(auVar183._0_32_,auVar271,auVar89);
            auVar183 = ZEXT1664(auVar214);
            local_1d8 = ZEXT1632(auVar214);
            auVar214 = vfmadd231ps_fma(auVar287._0_32_,auVar271,auVar126);
            auVar287 = ZEXT1664(auVar214);
            local_198 = ZEXT1632(auVar214);
            pauVar37 = pauVar37 + 1;
            pauVar36 = pauVar36 + 1;
            pauVar59 = pauVar59 + 1;
            pauVar55 = pauVar55 + 1;
            pauVar56 = pauVar56 + 1;
            iVar41 = iVar41 + 8;
          } while (iVar41 < (int)uVar54);
        }
        auVar214 = ZEXT816(0) << 0x40;
        if ((int)(uVar29 | 3) < (int)uVar54) {
          auVar287 = ZEXT864(0);
          lVar42 = 0;
          auVar127 = ZEXT864(0);
          auVar367 = ZEXT816(0);
          pauVar57 = pauVar37;
          uVar44 = uVar29;
          do {
            auVar12._8_8_ = 0;
            auVar12._0_8_ = *(ulong *)(*pauVar36 + lVar42);
            auVar267 = vcvtph2ps_f16c(auVar12);
            auVar13._8_8_ = 0;
            auVar13._0_8_ = *(ulong *)(*pauVar59 + lVar42);
            auVar68 = vcvtph2ps_f16c(auVar13);
            auVar14._8_8_ = 0;
            auVar14._0_8_ = *(ulong *)(*pauVar55 + lVar42);
            auVar139 = vcvtph2ps_f16c(auVar14);
            auVar290 = *(undefined1 (*) [16])(*pauVar37 + lVar42 * 2);
            auVar15._8_8_ = 0;
            auVar15._0_8_ = *(ulong *)(*pauVar56 + lVar42);
            auVar12 = vcvtph2ps_f16c(auVar15);
            auVar214 = vfmadd231ps_fma(auVar214,auVar290,auVar267);
            auVar367 = vfmadd231ps_fma(auVar367,auVar290,auVar68);
            auVar267 = vfmadd231ps_fma(auVar127._0_16_,auVar290,auVar139);
            auVar127 = ZEXT1664(auVar267);
            local_298 = vfmadd231ps_fma(auVar287._0_16_,auVar290,auVar12);
            auVar287 = ZEXT1664(local_298);
            pauVar57 = (undefined1 (*) [32])(*pauVar57 + 0x10);
            uVar29 = uVar44 + 4;
            iVar41 = uVar44 + 7;
            lVar42 = lVar42 + 8;
            uVar44 = uVar29;
          } while (iVar41 < (int)uVar54);
          pauVar56 = (undefined1 (*) [16])(*pauVar56 + lVar42);
          pauVar55 = (undefined1 (*) [16])(*pauVar55 + lVar42);
          pauVar59 = (undefined1 (*) [16])(*pauVar59 + lVar42);
          pauVar36 = (undefined1 (*) [16])(*pauVar36 + lVar42);
          pauVar37 = pauVar57;
        }
        else {
          auVar367 = ZEXT816(0);
          auVar267 = SUB6416(ZEXT864(0),0);
          local_298 = SUB6416(ZEXT864(0),0);
        }
        local_278._4_4_ = 0;
        local_278._0_4_ = uVar54 - uVar29;
        local_278._8_8_ = auVar130._8_8_;
        local_288 = fVar95;
        if (uVar54 - uVar29 != 0 && (int)uVar29 <= (int)uVar54) {
          lVar42 = 0;
          do {
            local_2b8._0_16_ = auVar185;
            uVar29 = *(uint *)(*pauVar37 + lVar42 * 4);
            fVar95 = float16_to_float32(*(unsigned_short *)(*pauVar36 + lVar42 * 2));
            auVar271 = _local_218;
            local_218._4_4_ = extraout_XMM0_Db_06;
            local_218._0_4_ = fVar95;
            fStack_210 = (float)extraout_XMM0_Dc_05;
            _fStack_208 = auVar271._16_16_;
            fStack_20c = (float)extraout_XMM0_Dd_05;
            uVar44 = *(uint *)(*pauVar37 + lVar42 * 4);
            fVar95 = float16_to_float32(*(unsigned_short *)(*pauVar59 + lVar42 * 2));
            local_248 = ZEXT416(*(uint *)(*pauVar37 + lVar42 * 4));
            local_258._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar55 + lVar42 * 2));
            local_258._4_4_ = extraout_XMM0_Db_07;
            local_258._8_4_ = extraout_XMM0_Dc_06;
            local_258._12_4_ = extraout_XMM0_Dd_06;
            local_268 = ZEXT416(*(uint *)(*pauVar37 + lVar42 * 4));
            auVar127._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar56 + lVar42 * 2));
            auVar127._4_60_ = extraout_var_00;
            auVar130 = vinsertps_avx(_local_218,ZEXT416((uint)fVar95),0x10);
            auVar130 = vinsertps_avx(auVar130,ZEXT416((uint)local_258._0_4_),0x20);
            auVar130 = vinsertps_avx(auVar130,auVar127._0_16_,0x30);
            auVar185 = vinsertps_avx(ZEXT416(uVar29),ZEXT416(uVar44),0x10);
            auVar185 = vinsertps_avx(auVar185,ZEXT416((uint)local_248._0_4_),0x20);
            auVar185 = vinsertps_avx(auVar185,ZEXT416((uint)local_268._0_4_),0x30);
            auVar185 = vfmadd231ps_fma(local_2b8._0_16_,auVar130,auVar185);
            lVar42 = lVar42 + 1;
          } while (local_278._0_4_ != (int)lVar42);
        }
        auVar271 = vhaddps_avx(local_1b8,local_1f8);
        auVar91 = vhaddps_avx(local_1d8,local_198);
        auVar271 = vhaddps_avx(auVar271,auVar91);
        auVar68 = vunpcklps_avx(auVar214,auVar367);
        auVar139 = vunpcklps_avx(auVar267,local_298);
        auVar214 = vunpckhps_avx(auVar214,auVar367);
        auVar290 = vunpckhps_avx(auVar267,local_298);
        auVar130 = vmovlhps_avx(auVar68,auVar139);
        auVar267 = vunpckhpd_avx(auVar68,auVar139);
        auVar367 = vmovlhps_avx(auVar214,auVar290);
        auVar290 = vunpckhpd_avx(auVar214,auVar290);
        auVar214._0_4_ =
             auVar267._0_4_ + auVar130._0_4_ + auVar367._0_4_ + auVar290._0_4_ +
             auVar185._0_4_ + auVar271._0_4_ + auVar271._16_4_;
        auVar214._4_4_ =
             auVar267._4_4_ + auVar130._4_4_ + auVar367._4_4_ + auVar290._4_4_ +
             auVar185._4_4_ + auVar271._4_4_ + auVar271._20_4_;
        auVar214._8_4_ =
             auVar267._8_4_ + auVar130._8_4_ + auVar367._8_4_ + auVar290._8_4_ +
             auVar185._8_4_ + auVar271._8_4_ + auVar271._24_4_;
        auVar214._12_4_ =
             auVar267._12_4_ + auVar130._12_4_ + auVar367._12_4_ + auVar290._12_4_ +
             auVar185._12_4_ + auVar271._12_4_ + auVar271._28_4_;
        switch(uVar17) {
        case 1:
          auVar214 = vmaxps_avx(auVar214,ZEXT816(0) << 0x20);
          break;
        case 2:
          auVar130 = vmaxps_avx(auVar214,ZEXT816(0) << 0x20);
          auVar185 = vminps_avx(auVar214,ZEXT816(0) << 0x20);
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var18);
          auVar72._4_4_ = uVar2;
          auVar72._0_4_ = uVar2;
          auVar72._8_4_ = uVar2;
          auVar72._12_4_ = uVar2;
          auVar214 = vfmadd213ps_fma(auVar72,auVar185,auVar130);
          break;
        case 3:
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var18);
          auVar103._4_4_ = uVar2;
          auVar103._0_4_ = uVar2;
          auVar103._8_4_ = uVar2;
          auVar103._12_4_ = uVar2;
          uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var18))[1];
          auVar152._4_4_ = uVar2;
          auVar152._0_4_ = uVar2;
          auVar152._8_4_ = uVar2;
          auVar152._12_4_ = uVar2;
          auVar130 = vmaxps_avx(auVar214,auVar103);
          auVar214 = vminps_avx(auVar130,auVar152);
          break;
        case 4:
          uVar1 = CONCAT44(auVar214._4_4_,auVar214._0_4_);
          auVar69._0_8_ = uVar1 ^ 0x8000000080000000;
          auVar69._8_4_ = -auVar214._8_4_;
          auVar69._12_4_ = -auVar214._12_4_;
          auVar104._8_4_ = 0x42b0c0a5;
          auVar104._0_8_ = 0x42b0c0a542b0c0a5;
          auVar104._12_4_ = 0x42b0c0a5;
          auVar130 = vminps_avx(auVar69,auVar104);
          auVar105._8_4_ = 0xc2b0c0a5;
          auVar105._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar105._12_4_ = 0xc2b0c0a5;
          auVar214 = vmaxps_avx(auVar130,auVar105);
          auVar106._8_4_ = 0x3fb8aa3b;
          auVar106._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar106._12_4_ = 0x3fb8aa3b;
          auVar153._8_4_ = 0x3f000000;
          auVar153._0_8_ = 0x3f0000003f000000;
          auVar153._12_4_ = 0x3f000000;
          auVar130 = vfmadd213ps_fma(auVar106,auVar214,auVar153);
          auVar200._0_4_ = (int)auVar130._0_4_;
          auVar200._4_4_ = (int)auVar130._4_4_;
          auVar200._8_4_ = (int)auVar130._8_4_;
          auVar200._12_4_ = (int)auVar130._12_4_;
          auVar185 = vcvtdq2ps_avx(auVar200);
          auVar130 = vcmpps_avx(auVar130,auVar185,1);
          auVar107._8_4_ = 0x3f800000;
          auVar107._0_8_ = 0x3f8000003f800000;
          auVar107._12_4_ = 0x3f800000;
          auVar130 = vandps_avx(auVar130,auVar107);
          auVar130 = vsubps_avx(auVar185,auVar130);
          auVar232._8_4_ = 0x3f318000;
          auVar232._0_8_ = 0x3f3180003f318000;
          auVar232._12_4_ = 0x3f318000;
          auVar185 = vfmsub213ps_fma(auVar232,auVar130,auVar214);
          auVar70._8_4_ = 0x395e8083;
          auVar70._0_8_ = 0x395e8083395e8083;
          auVar70._12_4_ = 0x395e8083;
          auVar214 = vfmsub213ps_fma(auVar70,auVar130,auVar185);
          auVar233._0_4_ = auVar214._0_4_ * auVar214._0_4_;
          auVar233._4_4_ = auVar214._4_4_ * auVar214._4_4_;
          auVar233._8_4_ = auVar214._8_4_ * auVar214._8_4_;
          auVar233._12_4_ = auVar214._12_4_ * auVar214._12_4_;
          auVar246._8_4_ = 0x3ab743ce;
          auVar246._0_8_ = 0x3ab743ce3ab743ce;
          auVar246._12_4_ = 0x3ab743ce;
          auVar269._8_4_ = 0x39506967;
          auVar269._0_8_ = 0x3950696739506967;
          auVar269._12_4_ = 0x39506967;
          auVar185 = vfmadd213ps_fma(auVar269,auVar214,auVar246);
          auVar247._8_4_ = 0x3c088908;
          auVar247._0_8_ = 0x3c0889083c088908;
          auVar247._12_4_ = 0x3c088908;
          auVar185 = vfmadd231ps_fma(auVar247,auVar214,auVar185);
          auVar270._8_4_ = 0x3d2aa9c1;
          auVar270._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar270._12_4_ = 0x3d2aa9c1;
          auVar185 = vfmadd231ps_fma(auVar270,auVar214,auVar185);
          auVar248._8_4_ = 0x3e2aaaaa;
          auVar248._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar248._12_4_ = 0x3e2aaaaa;
          auVar185 = vfmadd231ps_fma(auVar248,auVar214,auVar185);
          auVar185 = vfmadd213ps_fma(auVar185,auVar214,auVar153);
          auVar185 = vfmadd213ps_fma(auVar185,auVar233,auVar214);
          auVar154._0_4_ = auVar185._0_4_ + 1.0;
          auVar154._4_4_ = auVar185._4_4_ + 1.0;
          auVar154._8_4_ = auVar185._8_4_ + 1.0;
          auVar154._12_4_ = auVar185._12_4_ + 1.0;
          auVar71._0_4_ = (int)auVar130._0_4_;
          auVar71._4_4_ = (int)auVar130._4_4_;
          auVar71._8_4_ = (int)auVar130._8_4_;
          auVar71._12_4_ = (int)auVar130._12_4_;
          auVar130 = vpslld_avx(auVar71,0x17);
          auVar130 = vpaddd_avx(auVar130,auVar107);
          auVar185 = vfmadd213ps_fma(auVar130,auVar154,auVar107);
          auVar130 = vrcpps_avx(auVar185);
          auVar185 = vfmsub213ps_fma(auVar185,auVar130,auVar107);
          auVar214 = vfnmadd132ps_fma(auVar185,auVar130,auVar130);
          break;
        case 5:
          auVar100._8_4_ = 0x42b0c0a5;
          auVar100._0_8_ = 0x42b0c0a542b0c0a5;
          auVar100._12_4_ = 0x42b0c0a5;
          auVar130 = vminps_avx(auVar214,auVar100);
          auVar140._8_4_ = 0xc2b0c0a5;
          auVar140._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar140._12_4_ = 0xc2b0c0a5;
          auVar367 = vmaxps_avx(auVar130,auVar140);
          auVar245._8_4_ = 0x3fb8aa3b;
          auVar245._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar245._12_4_ = 0x3fb8aa3b;
          auVar291._8_4_ = 0x3f000000;
          auVar291._0_8_ = 0x3f0000003f000000;
          auVar291._12_4_ = 0x3f000000;
          auVar130 = vfmadd213ps_fma(auVar245,auVar367,auVar291);
          auVar197._0_4_ = (int)auVar130._0_4_;
          auVar197._4_4_ = (int)auVar130._4_4_;
          auVar197._8_4_ = (int)auVar130._8_4_;
          auVar197._12_4_ = (int)auVar130._12_4_;
          auVar185 = vcvtdq2ps_avx(auVar197);
          auVar130 = vcmpps_avx(auVar130,auVar185,1);
          auVar268._8_4_ = 0x3f800000;
          auVar268._0_8_ = 0x3f8000003f800000;
          auVar268._12_4_ = 0x3f800000;
          auVar130 = vandps_avx(auVar130,auVar268);
          auVar130 = vsubps_avx(auVar185,auVar130);
          auVar198._8_4_ = 0x3f318000;
          auVar198._0_8_ = 0x3f3180003f318000;
          auVar198._12_4_ = 0x3f318000;
          auVar185 = vfmsub231ps_fma(auVar367,auVar130,auVar198);
          auVar312._8_4_ = 0xb95e8083;
          auVar312._0_8_ = 0xb95e8083b95e8083;
          auVar312._12_4_ = 0xb95e8083;
          auVar367 = vfnmsub231ps_fma(auVar185,auVar130,auVar312);
          auVar374._0_4_ = auVar367._0_4_ * auVar367._0_4_;
          auVar374._4_4_ = auVar367._4_4_ * auVar367._4_4_;
          auVar374._8_4_ = auVar367._8_4_ * auVar367._8_4_;
          auVar374._12_4_ = auVar367._12_4_ * auVar367._12_4_;
          auVar141._8_4_ = 0x3ab743ce;
          auVar141._0_8_ = 0x3ab743ce3ab743ce;
          auVar141._12_4_ = 0x3ab743ce;
          auVar101._8_4_ = 0x39506967;
          auVar101._0_8_ = 0x3950696739506967;
          auVar101._12_4_ = 0x39506967;
          auVar185 = vfmadd213ps_fma(auVar101,auVar367,auVar141);
          auVar343._8_4_ = 0x3c088908;
          auVar343._0_8_ = 0x3c0889083c088908;
          auVar343._12_4_ = 0x3c088908;
          auVar185 = vfmadd213ps_fma(auVar185,auVar367,auVar343);
          auVar349._8_4_ = 0x3d2aa9c1;
          auVar349._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar349._12_4_ = 0x3d2aa9c1;
          auVar185 = vfmadd213ps_fma(auVar185,auVar367,auVar349);
          auVar355._8_4_ = 0x3e2aaaaa;
          auVar355._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar355._12_4_ = 0x3e2aaaaa;
          auVar185 = vfmadd213ps_fma(auVar185,auVar367,auVar355);
          auVar185 = vfmadd213ps_fma(auVar185,auVar367,auVar291);
          auVar185 = vfmadd213ps_fma(auVar185,auVar374,auVar367);
          auVar220._0_4_ = auVar185._0_4_ + 1.0;
          auVar220._4_4_ = auVar185._4_4_ + 1.0;
          auVar220._8_4_ = auVar185._8_4_ + 1.0;
          auVar220._12_4_ = auVar185._12_4_ + 1.0;
          auVar366._0_4_ = (int)auVar130._0_4_;
          auVar366._4_4_ = (int)auVar130._4_4_;
          auVar366._8_4_ = (int)auVar130._8_4_;
          auVar366._12_4_ = (int)auVar130._12_4_;
          auVar130 = vpslld_avx(auVar366,0x17);
          auVar130 = vpaddd_avx(auVar130,auVar268);
          auVar130 = vfmadd213ps_fma(auVar130,auVar220,auVar268);
          auVar185 = vcmpps_avx(auVar130,ZEXT816(0) << 0x40,2);
          auVar221._8_4_ = 0x800000;
          auVar221._0_8_ = 0x80000000800000;
          auVar221._12_4_ = 0x800000;
          auVar130 = vmaxps_avx(auVar130,auVar221);
          auVar367 = vpsrld_avx(auVar130,0x17);
          auVar375._8_4_ = 0x807fffff;
          auVar375._0_8_ = 0x807fffff807fffff;
          auVar375._12_4_ = 0x807fffff;
          auVar130 = vandps_avx(auVar375,auVar130);
          auVar267 = vorps_avx(auVar130,auVar291);
          auVar376._8_4_ = 0xffffff82;
          auVar376._0_8_ = 0xffffff82ffffff82;
          auVar376._12_4_ = 0xffffff82;
          auVar290 = vpaddd_avx(auVar367,auVar376);
          auVar368._8_4_ = 0x3f3504f3;
          auVar368._0_8_ = 0x3f3504f33f3504f3;
          auVar368._12_4_ = 0x3f3504f3;
          auVar367 = vcmpps_avx(auVar267,auVar368,1);
          auVar130 = vandps_avx(auVar367,auVar267);
          auVar369._0_4_ = auVar267._0_4_ + -1.0 + auVar130._0_4_;
          auVar369._4_4_ = auVar267._4_4_ + -1.0 + auVar130._4_4_;
          auVar369._8_4_ = auVar267._8_4_ + -1.0 + auVar130._8_4_;
          auVar369._12_4_ = auVar267._12_4_ + -1.0 + auVar130._12_4_;
          auVar267 = vcvtdq2ps_avx(auVar290);
          auVar130 = vandps_avx(auVar367,auVar268);
          auVar130 = vsubps_avx(auVar267,auVar130);
          auVar142._8_4_ = 0xbdebd1b8;
          auVar142._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar142._12_4_ = 0xbdebd1b8;
          auVar222._8_4_ = 0x3d9021bb;
          auVar222._0_8_ = 0x3d9021bb3d9021bb;
          auVar222._12_4_ = 0x3d9021bb;
          auVar367 = vfmadd213ps_fma(auVar222,auVar369,auVar142);
          auVar143._8_4_ = 0x3def251a;
          auVar143._0_8_ = 0x3def251a3def251a;
          auVar143._12_4_ = 0x3def251a;
          auVar367 = vfmadd231ps_fma(auVar143,auVar369,auVar367);
          auVar223._8_4_ = 0xbdfe5d4f;
          auVar223._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar223._12_4_ = 0xbdfe5d4f;
          auVar367 = vfmadd231ps_fma(auVar223,auVar369,auVar367);
          auVar144._8_4_ = 0x3e11e9bf;
          auVar144._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar144._12_4_ = 0x3e11e9bf;
          auVar367 = vfmadd231ps_fma(auVar144,auVar369,auVar367);
          auVar224._8_4_ = 0xbe2aae50;
          auVar224._0_8_ = 0xbe2aae50be2aae50;
          auVar224._12_4_ = 0xbe2aae50;
          auVar367 = vfmadd231ps_fma(auVar224,auVar369,auVar367);
          auVar145._8_4_ = 0x3e4cceac;
          auVar145._0_8_ = 0x3e4cceac3e4cceac;
          auVar145._12_4_ = 0x3e4cceac;
          auVar367 = vfmadd231ps_fma(auVar145,auVar369,auVar367);
          auVar225._8_4_ = 0xbe7ffffc;
          auVar225._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar225._12_4_ = 0xbe7ffffc;
          auVar367 = vfmadd231ps_fma(auVar225,auVar369,auVar367);
          auVar146._8_4_ = 0x3eaaaaaa;
          auVar146._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar146._12_4_ = 0x3eaaaaaa;
          auVar367 = vfmadd231ps_fma(auVar146,auVar369,auVar367);
          auVar226._0_4_ = auVar369._0_4_ * auVar369._0_4_;
          auVar226._4_4_ = auVar369._4_4_ * auVar369._4_4_;
          auVar226._8_4_ = auVar369._8_4_ * auVar369._8_4_;
          auVar226._12_4_ = auVar369._12_4_ * auVar369._12_4_;
          auVar147._0_4_ = auVar369._0_4_ * auVar226._0_4_ * auVar367._0_4_;
          auVar147._4_4_ = auVar369._4_4_ * auVar226._4_4_ * auVar367._4_4_;
          auVar147._8_4_ = auVar369._8_4_ * auVar226._8_4_ * auVar367._8_4_;
          auVar147._12_4_ = auVar369._12_4_ * auVar226._12_4_ * auVar367._12_4_;
          auVar367 = vfmadd231ps_fma(auVar147,auVar130,auVar312);
          auVar367 = vfmsub231ps_fma(auVar367,auVar291,auVar226);
          auVar367 = vsubps_avx(auVar367,auVar369);
          auVar130 = vfnmadd231ps_fma(auVar367,auVar198,auVar130);
          auVar148._0_4_ = auVar130._0_4_ + auVar130._0_4_;
          auVar148._4_4_ = auVar130._4_4_ + auVar130._4_4_;
          auVar148._8_4_ = auVar130._8_4_ + auVar130._8_4_;
          auVar148._12_4_ = auVar130._12_4_ + auVar130._12_4_;
          auVar227._8_4_ = 0x7fffffff;
          auVar227._0_8_ = 0x7fffffff7fffffff;
          auVar227._12_4_ = 0x7fffffff;
          auVar130 = vblendvps_avx(auVar148,auVar227,auVar185);
          auVar228._8_4_ = 0x42b0c0a5;
          auVar228._0_8_ = 0x42b0c0a542b0c0a5;
          auVar228._12_4_ = 0x42b0c0a5;
          auVar130 = vminps_avx(auVar130,auVar228);
          auVar229._8_4_ = 0xc2b0c0a5;
          auVar229._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar229._12_4_ = 0xc2b0c0a5;
          auVar367 = vmaxps_avx(auVar130,auVar229);
          auVar130 = vfmadd213ps_fma(auVar245,auVar367,auVar291);
          auVar230._0_4_ = (int)auVar130._0_4_;
          auVar230._4_4_ = (int)auVar130._4_4_;
          auVar230._8_4_ = (int)auVar130._8_4_;
          auVar230._12_4_ = (int)auVar130._12_4_;
          auVar185 = vcvtdq2ps_avx(auVar230);
          auVar130 = vcmpps_avx(auVar130,auVar185,1);
          auVar130 = vandps_avx(auVar130,auVar268);
          auVar130 = vsubps_avx(auVar185,auVar130);
          auVar185 = vfmsub213ps_fma(auVar198,auVar130,auVar367);
          auVar367 = vfnmsub231ps_fma(auVar185,auVar130,auVar312);
          auVar149._8_4_ = 0x3ab743ce;
          auVar149._0_8_ = 0x3ab743ce3ab743ce;
          auVar149._12_4_ = 0x3ab743ce;
          auVar185 = vfmadd213ps_fma(auVar101,auVar367,auVar149);
          auVar185 = vfmadd213ps_fma(auVar185,auVar367,auVar343);
          auVar185 = vfmadd213ps_fma(auVar185,auVar367,auVar349);
          auVar185 = vfmadd213ps_fma(auVar185,auVar367,auVar355);
          auVar185 = vfmadd213ps_fma(auVar185,auVar367,auVar291);
          auVar150._0_4_ = auVar367._0_4_ * auVar367._0_4_;
          auVar150._4_4_ = auVar367._4_4_ * auVar367._4_4_;
          auVar150._8_4_ = auVar367._8_4_ * auVar367._8_4_;
          auVar150._12_4_ = auVar367._12_4_ * auVar367._12_4_;
          auVar185 = vfmadd213ps_fma(auVar185,auVar150,auVar367);
          auVar102._0_4_ = auVar185._0_4_ + 1.0;
          auVar102._4_4_ = auVar185._4_4_ + 1.0;
          auVar102._8_4_ = auVar185._8_4_ + 1.0;
          auVar102._12_4_ = auVar185._12_4_ + 1.0;
          auVar151._0_4_ = (int)auVar130._0_4_;
          auVar151._4_4_ = (int)auVar130._4_4_;
          auVar151._8_4_ = (int)auVar130._8_4_;
          auVar151._12_4_ = (int)auVar130._12_4_;
          auVar130 = vpslld_avx(auVar151,0x17);
          auVar130 = vpaddd_avx(auVar130,auVar268);
          auVar185 = vfmadd213ps_fma(auVar130,auVar102,auVar268);
          auVar130 = vrcpps_avx(auVar185);
          auVar199._0_4_ = auVar130._0_4_ + auVar130._0_4_;
          auVar199._4_4_ = auVar130._4_4_ + auVar130._4_4_;
          auVar199._8_4_ = auVar130._8_4_ + auVar130._8_4_;
          auVar199._12_4_ = auVar130._12_4_ + auVar130._12_4_;
          auVar231._8_4_ = 0x40000000;
          auVar231._0_8_ = 0x4000000040000000;
          auVar231._12_4_ = 0x40000000;
          auVar185 = vfmsub231ps_fma(auVar231,auVar199,auVar185);
          auVar130 = vfnmadd213ps_fma(auVar185,auVar130,auVar199);
          auVar214 = vfmsub231ps_fma(auVar214,auVar214,auVar130);
          break;
        case 6:
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var18);
          auVar108._4_4_ = uVar2;
          auVar108._0_4_ = uVar2;
          auVar108._8_4_ = uVar2;
          auVar108._12_4_ = uVar2;
          uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var18))[1];
          auVar155._4_4_ = uVar2;
          auVar155._0_4_ = uVar2;
          auVar155._8_4_ = uVar2;
          auVar155._12_4_ = uVar2;
          auVar130 = vfmadd231ps_fma(auVar155,auVar214,auVar108);
          auVar130 = vmaxps_avx(auVar130,ZEXT416(0) << 0x20);
          auVar156._8_4_ = 0x3f800000;
          auVar156._0_8_ = 0x3f8000003f800000;
          auVar156._12_4_ = 0x3f800000;
          auVar130 = vminps_avx(auVar130,auVar156);
          auVar214._0_4_ = auVar130._0_4_ * auVar214._0_4_;
          auVar214._4_4_ = auVar130._4_4_ * auVar214._4_4_;
          auVar214._8_4_ = auVar130._8_4_ * auVar214._8_4_;
          auVar214._12_4_ = auVar130._12_4_ * auVar214._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar32 * 4) = auVar214;
        fVar95 = local_288;
      }
      iVar31 = (int)uVar32 + (int)fVar95 * 4;
      iVar41 = 0;
      if ((int)uVar30 <= iVar31) goto LAB_002d7c3b;
      uVar32 = (ulong)iVar31;
      do {
        auVar287 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar20 != 0) {
          auVar287 = ZEXT464(*(uint *)(lVar20 + uVar32 * 4));
        }
        fVar95 = auVar287._0_4_;
        pauVar36 = (undefined1 (*) [16])
                   ((long)(this->weight_data_tm).w * uVar32 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        pauVar37 = (undefined1 (*) [32])local_308._0_8_;
        if ((int)uVar54 < 8) {
          _local_218 = SUB6432(ZEXT864(0),0);
          uVar30 = 0;
        }
        else {
          auVar127 = ZEXT864(0);
          iVar41 = 7;
          do {
            auVar130 = vlddqu_avx(*pauVar36);
            auVar271 = vcvtph2ps_f16c(auVar130);
            auVar130 = vfmadd231ps_fma(auVar127._0_32_,auVar271,*pauVar37);
            auVar127 = ZEXT1664(auVar130);
            _local_218 = ZEXT1632(auVar130);
            pauVar37 = pauVar37 + 1;
            pauVar36 = pauVar36 + 1;
            iVar41 = iVar41 + 8;
            uVar30 = uVar54 & 0xfffffff8;
          } while (iVar41 < (int)uVar54);
        }
        auVar130 = ZEXT816(0) << 0x40;
        uVar29 = uVar30 | 3;
        while ((int)uVar29 < (int)uVar54) {
          auVar16._8_8_ = 0;
          auVar16._0_8_ = *(ulong *)*pauVar36;
          auVar185 = vcvtph2ps_f16c(auVar16);
          auVar130 = vfmadd231ps_fma(auVar130,auVar185,*(undefined1 (*) [16])*pauVar37);
          pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
          pauVar36 = (undefined1 (*) [16])(*pauVar36 + 8);
          uVar29 = uVar30 + 7;
          uVar30 = uVar30 + 4;
        }
        if ((int)uVar30 < (int)uVar54) {
          lVar42 = 0;
          do {
            local_2b8._0_4_ = auVar287._0_4_;
            uVar29 = *(uint *)(*pauVar37 + lVar42 * 4);
            auVar183._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar36 + lVar42 * 2));
            auVar183._4_60_ = extraout_var_01;
            auVar185 = vfmadd231ss_fma(ZEXT416((uint)local_2b8._0_4_),auVar183._0_16_,
                                       ZEXT416(uVar29));
            fVar95 = auVar185._0_4_;
            auVar287 = ZEXT1664(auVar185);
            lVar42 = lVar42 + 1;
          } while (uVar54 - uVar30 != (int)lVar42);
        }
        local_378 = auVar130._0_4_;
        fStack_374 = auVar130._4_4_;
        fStack_370 = auVar130._8_4_;
        fStack_36c = auVar130._12_4_;
        auVar73._0_4_ = (float)local_218._0_4_ + local_378 + fStack_208;
        auVar73._4_4_ = (float)local_218._4_4_ + fStack_374 + fStack_204;
        auVar73._8_4_ = fStack_210 + fStack_370 + fStack_200;
        auVar73._12_4_ = fStack_20c + fStack_36c + fStack_1fc;
        auVar130 = vhaddps_avx(auVar73,auVar73);
        auVar130 = vhaddps_avx(auVar130,auVar130);
        fVar95 = auVar130._0_4_ + fVar95;
        auVar130 = ZEXT416((uint)fVar95);
        fVar128 = fVar95;
        switch(uVar17) {
        case 1:
          auVar130 = vmaxss_avx(auVar130,ZEXT416(0));
          fVar128 = auVar130._0_4_;
          break;
        case 2:
          auVar130 = vcmpss_avx(ZEXT816(0) << 0x20,auVar130,1);
          auVar158._8_4_ = 0x3f800000;
          auVar158._0_8_ = 0x3f8000003f800000;
          auVar158._12_4_ = 0x3f800000;
          auVar130 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var18)),auVar158,
                                   auVar130);
          fVar128 = auVar130._0_4_ * fVar95;
          break;
        case 3:
          fVar95 = (float)(*(uint **)(&this->field_0xe8 + (long)p_Var18))[1];
          auVar130 = vmaxss_avx(auVar130,ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var18)));
          fVar128 = auVar130._0_4_;
          if (fVar95 < auVar130._0_4_) {
            fVar128 = fVar95;
          }
          break;
        case 4:
          auVar130 = vminss_avx(auVar130,ZEXT416(0x42b0c0a5));
          auVar109._0_8_ = auVar130._0_8_ ^ 0x8000000080000000;
          auVar109._8_4_ = auVar130._8_4_ ^ 0x80000000;
          auVar109._12_4_ = auVar130._12_4_ ^ 0x80000000;
          auVar130 = vcmpss_avx(auVar130,ZEXT416(0xc2b0c0a5),1);
          auVar157._8_4_ = 0x42b0c0a5;
          auVar157._0_8_ = 0x42b0c0a542b0c0a5;
          auVar157._12_4_ = 0x42b0c0a5;
          auVar130 = vblendvps_avx(auVar109,auVar157,auVar130);
          fVar95 = expf(auVar130._0_4_);
          fVar128 = 1.0 / (fVar95 + 1.0);
          break;
        case 5:
          local_2b8._0_4_ = fVar95;
          fVar95 = expf(fVar95);
          fVar95 = logf(fVar95 + 1.0);
          fVar95 = tanhf(fVar95);
          fVar128 = fVar95 * (float)local_2b8._0_4_;
          break;
        case 6:
          fVar306 = **(float **)(&this->field_0xe8 + (long)p_Var18);
          fVar318 = (*(float **)(&this->field_0xe8 + (long)p_Var18))[1];
          fVar184 = -fVar318 / fVar306;
          fVar128 = 0.0;
          if ((fVar184 <= fVar95) && (fVar128 = fVar95, fVar95 <= fVar184 + 1.0 / fVar306)) {
            auVar130 = vfmadd213ss_fma(ZEXT416((uint)fVar306),auVar130,ZEXT416((uint)fVar318));
            fVar128 = auVar130._0_4_ * fVar95;
          }
        }
        *(float *)((long)top_blob->data + uVar32 * 4) = fVar128;
        uVar32 = uVar32 + 1;
      } while (uVar32 != local_238);
    }
    else if (iVar31 == 4) {
      iVar41 = 0;
      if ((int)uVar30 < 1) goto LAB_002d7c3b;
      uVar32 = 0;
      auVar287 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      do {
        auVar130 = ZEXT816(0) << 0x40;
        if (lVar20 != 0) {
          auVar130 = *(undefined1 (*) [16])(lVar20 + uVar32 * 0x10);
        }
        pauVar37 = (undefined1 (*) [32])
                   ((long)(this->weight_data_tm).w * uVar32 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        puVar39 = (undefined4 *)local_308._0_8_;
        if ((int)uVar54 < 8) {
          auVar91 = SUB6432(ZEXT864(0),0);
          auVar271 = SUB6432(ZEXT864(0),0);
          auVar183 = ZEXT864(0);
          auVar127 = ZEXT864(0);
          uVar29 = 0;
        }
        else {
          auVar127 = ZEXT864(0);
          iVar41 = 7;
          auVar183 = ZEXT864(0);
          auVar210 = ZEXT864(0);
          auVar379 = ZEXT864(0);
          do {
            uVar2 = *puVar39;
            auVar238._4_4_ = uVar2;
            auVar238._0_4_ = uVar2;
            auVar238._8_4_ = uVar2;
            auVar238._12_4_ = uVar2;
            uVar2 = puVar39[1];
            auVar238._20_4_ = uVar2;
            auVar238._16_4_ = uVar2;
            auVar238._24_4_ = uVar2;
            auVar238._28_4_ = uVar2;
            uVar2 = puVar39[2];
            auVar331._4_4_ = uVar2;
            auVar331._0_4_ = uVar2;
            auVar331._8_4_ = uVar2;
            auVar331._12_4_ = uVar2;
            uVar2 = puVar39[3];
            auVar331._20_4_ = uVar2;
            auVar331._16_4_ = uVar2;
            auVar331._24_4_ = uVar2;
            auVar331._28_4_ = uVar2;
            uVar2 = puVar39[4];
            auVar351._4_4_ = uVar2;
            auVar351._0_4_ = uVar2;
            auVar351._8_4_ = uVar2;
            auVar351._12_4_ = uVar2;
            uVar2 = puVar39[5];
            auVar351._20_4_ = uVar2;
            auVar351._16_4_ = uVar2;
            auVar351._24_4_ = uVar2;
            auVar351._28_4_ = uVar2;
            uVar2 = puVar39[6];
            auVar357._4_4_ = uVar2;
            auVar357._0_4_ = uVar2;
            auVar357._8_4_ = uVar2;
            auVar357._12_4_ = uVar2;
            uVar2 = puVar39[7];
            auVar357._20_4_ = uVar2;
            auVar357._16_4_ = uVar2;
            auVar357._24_4_ = uVar2;
            auVar357._28_4_ = uVar2;
            auVar271 = vlddqu_avx(*pauVar37);
            auVar91 = vlddqu_avx(pauVar37[1]);
            auVar78 = vcvtph2ps_f16c(auVar271._0_16_);
            auVar185 = vfmadd231ps_fma(auVar127._0_32_,auVar238,auVar78);
            auVar127 = ZEXT1664(auVar185);
            auVar271 = vcvtph2ps_f16c(auVar271._16_16_);
            auVar185 = vfmadd231ps_fma(auVar183._0_32_,auVar331,auVar271);
            auVar183 = ZEXT1664(auVar185);
            auVar271 = vcvtph2ps_f16c(auVar91._0_16_);
            auVar185 = vfmadd231ps_fma(auVar210._0_32_,auVar351,auVar271);
            auVar210 = ZEXT1664(auVar185);
            auVar271 = ZEXT1632(auVar185);
            auVar91 = vcvtph2ps_f16c(auVar91._16_16_);
            auVar185 = vfmadd231ps_fma(auVar379._0_32_,auVar357,auVar91);
            auVar379 = ZEXT1664(auVar185);
            auVar91 = ZEXT1632(auVar185);
            puVar39 = puVar39 + 8;
            pauVar37 = pauVar37 + 2;
            iVar41 = iVar41 + 8;
            uVar29 = uVar54 & 0xfffffff8;
          } while (iVar41 < (int)uVar54);
        }
        auVar89 = auVar127._0_32_;
        auVar78 = auVar183._0_32_;
        uVar44 = uVar29 | 3;
        while ((int)uVar44 < (int)uVar54) {
          uVar2 = *puVar39;
          auVar239._4_4_ = uVar2;
          auVar239._0_4_ = uVar2;
          auVar239._8_4_ = uVar2;
          auVar239._12_4_ = uVar2;
          uVar2 = puVar39[1];
          auVar239._20_4_ = uVar2;
          auVar239._16_4_ = uVar2;
          auVar239._24_4_ = uVar2;
          auVar239._28_4_ = uVar2;
          uVar2 = puVar39[2];
          auVar332._4_4_ = uVar2;
          auVar332._0_4_ = uVar2;
          auVar332._8_4_ = uVar2;
          auVar332._12_4_ = uVar2;
          uVar2 = puVar39[3];
          auVar332._20_4_ = uVar2;
          auVar332._16_4_ = uVar2;
          auVar332._24_4_ = uVar2;
          auVar332._28_4_ = uVar2;
          auVar78 = vlddqu_avx(*pauVar37);
          auVar89 = vcvtph2ps_f16c(auVar78._0_16_);
          auVar185 = vfmadd231ps_fma(auVar127._0_32_,auVar239,auVar89);
          auVar127 = ZEXT1664(auVar185);
          auVar89 = ZEXT1632(auVar185);
          auVar78 = vcvtph2ps_f16c(auVar78._16_16_);
          auVar185 = vfmadd231ps_fma(auVar183._0_32_,auVar332,auVar78);
          auVar183 = ZEXT1664(auVar185);
          auVar78 = ZEXT1632(auVar185);
          puVar39 = puVar39 + 4;
          pauVar37 = pauVar37 + 1;
          uVar44 = uVar29 + 7;
          uVar29 = uVar29 + 4;
        }
        if (uVar54 - uVar29 != 0 && (int)uVar29 <= (int)uVar54) {
          lVar42 = 0;
          do {
            auVar11._8_8_ = 0;
            auVar11._0_8_ = *(ulong *)(*pauVar37 + lVar42 * 8);
            auVar185 = vcvtph2ps_f16c(auVar11);
            uVar2 = puVar39[lVar42];
            auVar325._4_4_ = uVar2;
            auVar325._0_4_ = uVar2;
            auVar325._8_4_ = uVar2;
            auVar325._12_4_ = uVar2;
            auVar130 = vfmadd231ps_fma(auVar130,auVar325,auVar185);
            lVar42 = lVar42 + 1;
          } while (uVar54 - uVar29 != (int)lVar42);
        }
        fVar95 = auVar91._4_4_ + auVar271._4_4_ + auVar78._4_4_ + auVar89._4_4_;
        auVar96._0_4_ =
             auVar130._0_4_ +
             auVar91._16_4_ + auVar271._16_4_ + auVar78._16_4_ + auVar89._16_4_ +
             auVar91._0_4_ + auVar271._0_4_ + auVar78._0_4_ + auVar89._0_4_;
        auVar96._4_4_ = auVar130._4_4_ + fVar95 + fVar95;
        auVar96._8_4_ =
             auVar130._8_4_ +
             auVar91._24_4_ + auVar271._24_4_ + auVar78._24_4_ + auVar89._24_4_ +
             auVar91._8_4_ + auVar271._8_4_ + auVar78._8_4_ + auVar89._8_4_;
        auVar96._12_4_ =
             auVar130._12_4_ +
             auVar91._28_4_ + auVar271._28_4_ + auVar78._28_4_ + auVar89._28_4_ +
             auVar91._12_4_ + auVar271._12_4_ + auVar78._12_4_ + auVar89._12_4_;
        auVar130 = auVar287._0_16_;
        fVar95 = auVar287._0_4_;
        fVar128 = auVar287._4_4_;
        fVar306 = auVar287._8_4_;
        fVar318 = auVar287._12_4_;
        switch(uVar17) {
        case 1:
          auVar96 = vmaxps_avx(auVar96,_DAT_00554060);
          break;
        case 2:
          auVar130 = vmaxps_avx(auVar96,ZEXT816(0) << 0x40);
          auVar185 = vminps_avx(auVar96,ZEXT816(0) << 0x40);
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var18);
          auVar99._4_4_ = uVar2;
          auVar99._0_4_ = uVar2;
          auVar99._8_4_ = uVar2;
          auVar99._12_4_ = uVar2;
          auVar96 = vfmadd213ps_fma(auVar99,auVar185,auVar130);
          break;
        case 3:
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var18);
          auVar134._4_4_ = uVar2;
          auVar134._0_4_ = uVar2;
          auVar134._8_4_ = uVar2;
          auVar134._12_4_ = uVar2;
          uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var18))[1];
          auVar191._4_4_ = uVar2;
          auVar191._0_4_ = uVar2;
          auVar191._8_4_ = uVar2;
          auVar191._12_4_ = uVar2;
          auVar130 = vmaxps_avx(auVar96,auVar134);
          auVar96 = vminps_avx(auVar130,auVar191);
          break;
        case 4:
          uVar1 = CONCAT44(auVar96._4_4_,auVar96._0_4_);
          auVar97._0_8_ = uVar1 ^ 0x8000000080000000;
          auVar97._8_4_ = -auVar96._8_4_;
          auVar97._12_4_ = -auVar96._12_4_;
          auVar135._8_4_ = 0x42b0c0a5;
          auVar135._0_8_ = 0x42b0c0a542b0c0a5;
          auVar135._12_4_ = 0x42b0c0a5;
          auVar185 = vminps_avx(auVar97,auVar135);
          auVar136._8_4_ = 0xc2b0c0a5;
          auVar136._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar136._12_4_ = 0xc2b0c0a5;
          auVar367 = vmaxps_avx(auVar185,auVar136);
          auVar137._8_4_ = 0x3fb8aa3b;
          auVar137._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar137._12_4_ = 0x3fb8aa3b;
          auVar244._8_4_ = 0x3f000000;
          auVar244._0_8_ = 0x3f0000003f000000;
          auVar244._12_4_ = 0x3f000000;
          auVar185 = vfmadd213ps_fma(auVar137,auVar367,auVar244);
          auVar192._0_4_ = (int)auVar185._0_4_;
          auVar192._4_4_ = (int)auVar185._4_4_;
          auVar192._8_4_ = (int)auVar185._8_4_;
          auVar192._12_4_ = (int)auVar185._12_4_;
          auVar214 = vcvtdq2ps_avx(auVar192);
          auVar185 = vcmpps_avx(auVar185,auVar214,1);
          auVar185 = vandps_avx(auVar185,auVar130);
          auVar185 = vsubps_avx(auVar214,auVar185);
          auVar65._8_4_ = 0x3f318000;
          auVar65._0_8_ = 0x3f3180003f318000;
          auVar65._12_4_ = 0x3f318000;
          auVar214 = vfmsub231ps_fma(auVar367,auVar185,auVar65);
          auVar193._8_4_ = 0x395e8083;
          auVar193._0_8_ = 0x395e8083395e8083;
          auVar193._12_4_ = 0x395e8083;
          auVar367 = vfmsub231ps_fma(auVar214,auVar185,auVar193);
          auVar194._0_4_ = auVar367._0_4_ * auVar367._0_4_;
          auVar194._4_4_ = auVar367._4_4_ * auVar367._4_4_;
          auVar194._8_4_ = auVar367._8_4_ * auVar367._8_4_;
          auVar194._12_4_ = auVar367._12_4_ * auVar367._12_4_;
          auVar219._8_4_ = 0x39506967;
          auVar219._0_8_ = 0x3950696739506967;
          auVar219._12_4_ = 0x39506967;
          auVar311._8_4_ = 0x3ab743ce;
          auVar311._0_8_ = 0x3ab743ce3ab743ce;
          auVar311._12_4_ = 0x3ab743ce;
          auVar214 = vfmadd213ps_fma(auVar219,auVar367,auVar311);
          auVar289._8_4_ = 0x3c088908;
          auVar289._0_8_ = 0x3c0889083c088908;
          auVar289._12_4_ = 0x3c088908;
          auVar214 = vfmadd213ps_fma(auVar214,auVar367,auVar289);
          auVar66._8_4_ = 0x3d2aa9c1;
          auVar66._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar66._12_4_ = 0x3d2aa9c1;
          auVar214 = vfmadd213ps_fma(auVar214,auVar367,auVar66);
          auVar67._8_4_ = 0x3e2aaaaa;
          auVar67._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar67._12_4_ = 0x3e2aaaaa;
          auVar214 = vfmadd213ps_fma(auVar214,auVar367,auVar67);
          auVar214 = vfmadd213ps_fma(auVar214,auVar367,auVar244);
          auVar214 = vfmadd213ps_fma(auVar214,auVar194,auVar367);
          auVar195._0_4_ = auVar214._0_4_ + fVar95;
          auVar195._4_4_ = auVar214._4_4_ + fVar128;
          auVar195._8_4_ = auVar214._8_4_ + fVar306;
          auVar195._12_4_ = auVar214._12_4_ + fVar318;
          auVar98._0_4_ = (int)auVar185._0_4_;
          auVar98._4_4_ = (int)auVar185._4_4_;
          auVar98._8_4_ = (int)auVar185._8_4_;
          auVar98._12_4_ = (int)auVar185._12_4_;
          auVar185 = vpslld_avx(auVar98,0x17);
          auVar185 = vpaddd_avx(auVar185,auVar130);
          auVar214 = vfmadd213ps_fma(auVar185,auVar195,auVar130);
          auVar185 = vrcpps_avx(auVar214);
          auVar130 = vfmsub213ps_fma(auVar214,auVar185,auVar130);
          auVar96 = vfnmadd132ps_fma(auVar130,auVar185,auVar185);
          break;
        case 5:
          auVar347._8_4_ = 0x42b0c0a5;
          auVar347._0_8_ = 0x42b0c0a542b0c0a5;
          auVar347._12_4_ = 0x42b0c0a5;
          auVar185 = vminps_avx(auVar347,auVar96);
          auVar354._8_4_ = 0xc2b0c0a5;
          auVar354._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar354._12_4_ = 0xc2b0c0a5;
          auVar367 = vmaxps_avx(auVar354,auVar185);
          auVar360._8_4_ = 0x3fb8aa3b;
          auVar360._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar360._12_4_ = 0x3fb8aa3b;
          auVar243._8_4_ = 0x3f000000;
          auVar243._0_8_ = 0x3f0000003f000000;
          auVar243._12_4_ = 0x3f000000;
          auVar185 = vfmadd213ps_fma(auVar360,auVar367,auVar243);
          auVar211._0_4_ = (int)auVar185._0_4_;
          auVar211._4_4_ = (int)auVar185._4_4_;
          auVar211._8_4_ = (int)auVar185._8_4_;
          auVar211._12_4_ = (int)auVar185._12_4_;
          auVar214 = vcvtdq2ps_avx(auVar211);
          auVar185 = vcmpps_avx(auVar185,auVar214,1);
          auVar185 = vandps_avx(auVar185,auVar130);
          auVar185 = vsubps_avx(auVar214,auVar185);
          auVar348._8_4_ = 0x3f318000;
          auVar348._0_8_ = 0x3f3180003f318000;
          auVar348._12_4_ = 0x3f318000;
          auVar214 = vfmsub231ps_fma(auVar367,auVar185,auVar348);
          auVar266._8_4_ = 0xb95e8083;
          auVar266._0_8_ = 0xb95e8083b95e8083;
          auVar266._12_4_ = 0xb95e8083;
          auVar367 = vfnmsub231ps_fma(auVar214,auVar185,auVar266);
          auVar212._0_4_ = auVar367._0_4_ * auVar367._0_4_;
          auVar212._4_4_ = auVar367._4_4_ * auVar367._4_4_;
          auVar212._8_4_ = auVar367._8_4_ * auVar367._8_4_;
          auVar212._12_4_ = auVar367._12_4_ * auVar367._12_4_;
          auVar373._8_4_ = 0x39506967;
          auVar373._0_8_ = 0x3950696739506967;
          auVar373._12_4_ = 0x39506967;
          auVar365._8_4_ = 0x3ab743ce;
          auVar365._0_8_ = 0x3ab743ce3ab743ce;
          auVar365._12_4_ = 0x3ab743ce;
          auVar214 = vfmadd213ps_fma(auVar373,auVar367,auVar365);
          auVar288._8_4_ = 0x3c088908;
          auVar288._0_8_ = 0x3c0889083c088908;
          auVar288._12_4_ = 0x3c088908;
          auVar214 = vfmadd213ps_fma(auVar214,auVar367,auVar288);
          auVar326._8_4_ = 0x3d2aa9c1;
          auVar326._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar326._12_4_ = 0x3d2aa9c1;
          auVar214 = vfmadd213ps_fma(auVar214,auVar367,auVar326);
          auVar327._8_4_ = 0x3e2aaaaa;
          auVar327._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar327._12_4_ = 0x3e2aaaaa;
          auVar214 = vfmadd213ps_fma(auVar214,auVar367,auVar327);
          auVar214 = vfmadd213ps_fma(auVar214,auVar367,auVar243);
          auVar214 = vfmadd213ps_fma(auVar214,auVar212,auVar367);
          auVar213._0_4_ = auVar214._0_4_ + fVar95;
          auVar213._4_4_ = auVar214._4_4_ + fVar128;
          auVar213._8_4_ = auVar214._8_4_ + fVar306;
          auVar213._12_4_ = auVar214._12_4_ + fVar318;
          auVar132._0_4_ = (int)auVar185._0_4_;
          auVar132._4_4_ = (int)auVar185._4_4_;
          auVar132._8_4_ = (int)auVar185._8_4_;
          auVar132._12_4_ = (int)auVar185._12_4_;
          auVar185 = vpslld_avx(auVar132,0x17);
          auVar185 = vpaddd_avx(auVar185,auVar130);
          auVar290 = vfmadd213ps_fma(auVar185,auVar213,auVar130);
          auVar186._8_4_ = 0x800000;
          auVar186._0_8_ = 0x80000000800000;
          auVar186._12_4_ = 0x800000;
          auVar185 = vmaxps_avx(auVar290,auVar186);
          auVar214 = vpsrld_avx(auVar185,0x17);
          auVar307._8_4_ = 0xffffff82;
          auVar307._0_8_ = 0xffffff82ffffff82;
          auVar307._12_4_ = 0xffffff82;
          auVar214 = vpaddd_avx(auVar307,auVar214);
          auVar308._8_4_ = 0x807fffff;
          auVar308._0_8_ = 0x807fffff807fffff;
          auVar308._12_4_ = 0x807fffff;
          auVar185 = vandps_avx(auVar308,auVar185);
          auVar267 = vorps_avx(auVar185,auVar243);
          auVar367 = vcvtdq2ps_avx(auVar214);
          auVar309._8_4_ = 0x3f3504f3;
          auVar309._0_8_ = 0x3f3504f33f3504f3;
          auVar309._12_4_ = 0x3f3504f3;
          auVar214 = vcmpps_avx(auVar267,auVar309,1);
          auVar185 = vandps_avx(auVar214,auVar267);
          auVar187._0_4_ = auVar185._0_4_ + auVar267._0_4_ + -1.0;
          auVar187._4_4_ = auVar185._4_4_ + auVar267._4_4_ + -1.0;
          auVar187._8_4_ = auVar185._8_4_ + auVar267._8_4_ + -1.0;
          auVar187._12_4_ = auVar185._12_4_ + auVar267._12_4_ + -1.0;
          auVar185 = vandps_avx(auVar214,auVar130);
          auVar214 = vsubps_avx(auVar367,auVar185);
          auVar310._0_4_ = auVar187._0_4_ * auVar187._0_4_;
          auVar310._4_4_ = auVar187._4_4_ * auVar187._4_4_;
          auVar310._8_4_ = auVar187._8_4_ * auVar187._8_4_;
          auVar310._12_4_ = auVar187._12_4_ * auVar187._12_4_;
          auVar328._8_4_ = 0x3d9021bb;
          auVar328._0_8_ = 0x3d9021bb3d9021bb;
          auVar328._12_4_ = 0x3d9021bb;
          auVar335._8_4_ = 0xbdebd1b8;
          auVar335._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar335._12_4_ = 0xbdebd1b8;
          auVar185 = vfmadd213ps_fma(auVar328,auVar187,auVar335);
          auVar336._8_4_ = 0x3def251a;
          auVar336._0_8_ = 0x3def251a3def251a;
          auVar336._12_4_ = 0x3def251a;
          auVar185 = vfmadd213ps_fma(auVar185,auVar187,auVar336);
          auVar337._8_4_ = 0xbdfe5d4f;
          auVar337._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar337._12_4_ = 0xbdfe5d4f;
          auVar185 = vfmadd213ps_fma(auVar185,auVar187,auVar337);
          auVar338._8_4_ = 0x3e11e9bf;
          auVar338._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar338._12_4_ = 0x3e11e9bf;
          auVar185 = vfmadd213ps_fma(auVar185,auVar187,auVar338);
          auVar339._8_4_ = 0xbe2aae50;
          auVar339._0_8_ = 0xbe2aae50be2aae50;
          auVar339._12_4_ = 0xbe2aae50;
          auVar185 = vfmadd213ps_fma(auVar185,auVar187,auVar339);
          auVar340._8_4_ = 0x3e4cceac;
          auVar340._0_8_ = 0x3e4cceac3e4cceac;
          auVar340._12_4_ = 0x3e4cceac;
          auVar185 = vfmadd213ps_fma(auVar185,auVar187,auVar340);
          auVar341._8_4_ = 0xbe7ffffc;
          auVar341._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar341._12_4_ = 0xbe7ffffc;
          auVar185 = vfmadd213ps_fma(auVar185,auVar187,auVar341);
          auVar342._8_4_ = 0x3eaaaaaa;
          auVar342._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar342._12_4_ = 0x3eaaaaaa;
          auVar185 = vfmadd213ps_fma(auVar185,auVar187,auVar342);
          auVar329._0_4_ = auVar310._0_4_ * auVar187._0_4_ * auVar185._0_4_;
          auVar329._4_4_ = auVar310._4_4_ * auVar187._4_4_ * auVar185._4_4_;
          auVar329._8_4_ = auVar310._8_4_ * auVar187._8_4_ * auVar185._8_4_;
          auVar329._12_4_ = auVar310._12_4_ * auVar187._12_4_ * auVar185._12_4_;
          auVar185 = vfmadd231ps_fma(auVar329,auVar214,auVar266);
          auVar367 = vfmsub231ps_fma(auVar185,auVar243,auVar310);
          auVar185 = vcmpps_avx(auVar290,_DAT_00554060,2);
          auVar367 = vsubps_avx(auVar367,auVar187);
          auVar214 = vfnmadd231ps_fma(auVar367,auVar348,auVar214);
          auVar188._0_4_ = auVar214._0_4_ + auVar214._0_4_;
          auVar188._4_4_ = auVar214._4_4_ + auVar214._4_4_;
          auVar188._8_4_ = auVar214._8_4_ + auVar214._8_4_;
          auVar188._12_4_ = auVar214._12_4_ + auVar214._12_4_;
          auVar215._8_4_ = 0x7fffffff;
          auVar215._0_8_ = 0x7fffffff7fffffff;
          auVar215._12_4_ = 0x7fffffff;
          auVar185 = vblendvps_avx(auVar188,auVar215,auVar185);
          auVar189._8_4_ = 0x42b0c0a5;
          auVar189._0_8_ = 0x42b0c0a542b0c0a5;
          auVar189._12_4_ = 0x42b0c0a5;
          auVar185 = vminps_avx(auVar185,auVar189);
          auVar367 = vmaxps_avx(auVar354,auVar185);
          auVar185 = vfmadd213ps_fma(auVar360,auVar367,auVar243);
          auVar216._0_4_ = (int)auVar185._0_4_;
          auVar216._4_4_ = (int)auVar185._4_4_;
          auVar216._8_4_ = (int)auVar185._8_4_;
          auVar216._12_4_ = (int)auVar185._12_4_;
          auVar214 = vcvtdq2ps_avx(auVar216);
          auVar185 = vcmpps_avx(auVar185,auVar214,1);
          auVar185 = vandps_avx(auVar185,auVar130);
          auVar185 = vsubps_avx(auVar214,auVar185);
          auVar214 = vfmsub231ps_fma(auVar367,auVar185,auVar348);
          auVar367 = vfnmsub231ps_fma(auVar214,auVar185,auVar266);
          auVar287 = ZEXT1664(auVar130);
          auVar217._0_4_ = auVar367._0_4_ * auVar367._0_4_;
          auVar217._4_4_ = auVar367._4_4_ * auVar367._4_4_;
          auVar217._8_4_ = auVar367._8_4_ * auVar367._8_4_;
          auVar217._12_4_ = auVar367._12_4_ * auVar367._12_4_;
          auVar214 = vfmadd213ps_fma(auVar373,auVar367,auVar365);
          auVar214 = vfmadd213ps_fma(auVar214,auVar367,auVar288);
          auVar62._8_4_ = 0x3d2aa9c1;
          auVar62._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar62._12_4_ = 0x3d2aa9c1;
          auVar214 = vfmadd213ps_fma(auVar214,auVar367,auVar62);
          auVar63._8_4_ = 0x3e2aaaaa;
          auVar63._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar63._12_4_ = 0x3e2aaaaa;
          auVar214 = vfmadd213ps_fma(auVar214,auVar367,auVar63);
          auVar214 = vfmadd213ps_fma(auVar214,auVar367,auVar243);
          auVar214 = vfmadd213ps_fma(auVar214,auVar217,auVar367);
          auVar133._0_4_ = auVar214._0_4_ + fVar95;
          auVar133._4_4_ = auVar214._4_4_ + fVar128;
          auVar133._8_4_ = auVar214._8_4_ + fVar306;
          auVar133._12_4_ = auVar214._12_4_ + fVar318;
          auVar190._0_4_ = (int)auVar185._0_4_;
          auVar190._4_4_ = (int)auVar185._4_4_;
          auVar190._8_4_ = (int)auVar185._8_4_;
          auVar190._12_4_ = (int)auVar185._12_4_;
          auVar185 = vpslld_avx(auVar190,0x17);
          auVar185 = vpaddd_avx(auVar185,auVar130);
          auVar185 = vfmadd213ps_fma(auVar185,auVar133,auVar130);
          auVar130 = vrcpps_avx(auVar185);
          auVar218._0_4_ = auVar130._0_4_ + auVar130._0_4_;
          auVar218._4_4_ = auVar130._4_4_ + auVar130._4_4_;
          auVar218._8_4_ = auVar130._8_4_ + auVar130._8_4_;
          auVar218._12_4_ = auVar130._12_4_ + auVar130._12_4_;
          auVar64._8_4_ = 0x40000000;
          auVar64._0_8_ = 0x4000000040000000;
          auVar64._12_4_ = 0x40000000;
          auVar185 = vfmsub213ps_fma(auVar185,auVar218,auVar64);
          auVar130 = vfnmadd213ps_fma(auVar185,auVar130,auVar218);
          auVar96 = vfmsub231ps_fma(auVar96,auVar96,auVar130);
          break;
        case 6:
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var18);
          auVar138._4_4_ = uVar2;
          auVar138._0_4_ = uVar2;
          auVar138._8_4_ = uVar2;
          auVar138._12_4_ = uVar2;
          uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var18))[1];
          auVar196._4_4_ = uVar2;
          auVar196._0_4_ = uVar2;
          auVar196._8_4_ = uVar2;
          auVar196._12_4_ = uVar2;
          auVar185 = vfmadd231ps_fma(auVar196,auVar96,auVar138);
          auVar185 = vmaxps_avx(auVar185,_DAT_00554060);
          auVar130 = vminps_avx(auVar185,auVar130);
          auVar96._0_4_ = auVar130._0_4_ * auVar96._0_4_;
          auVar96._4_4_ = auVar130._4_4_ * auVar96._4_4_;
          auVar96._8_4_ = auVar130._8_4_ * auVar96._8_4_;
          auVar96._12_4_ = auVar130._12_4_ * auVar96._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar32 * 0x10) = auVar96;
        uVar32 = uVar32 + 1;
      } while (uVar32 != uVar30);
    }
    else {
      iVar41 = 0;
      if ((iVar31 != 8) || (iVar41 = 0, (int)uVar30 < 1)) goto LAB_002d7c3b;
      uVar32 = 0;
      auVar287 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      do {
        auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar20 != 0) {
          auVar127 = ZEXT3264(*(undefined1 (*) [32])(lVar20 + uVar32 * 0x20));
        }
        pauVar37 = (undefined1 (*) [32])
                   ((long)(this->weight_data_tm).w * uVar32 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        puVar39 = (undefined4 *)local_308._0_8_;
        if ((int)uVar54 < 8) {
          auVar91 = SUB6432(ZEXT864(0),0);
          auVar89 = SUB6432(ZEXT864(0),0);
          auVar271 = SUB6432(ZEXT864(0),0);
          auVar78 = SUB6432(ZEXT864(0),0);
          auVar183 = ZEXT864(0);
          auVar210 = ZEXT864(0);
          auVar379 = ZEXT864(0);
          uVar29 = 0;
        }
        else {
          auVar379 = ZEXT864(0);
          iVar41 = 7;
          auVar210 = ZEXT864(0);
          auVar183 = ZEXT864(0);
          auVar353 = ZEXT864(0);
          auVar265 = ZEXT864(0);
          auVar359 = ZEXT864(0);
          auVar334 = ZEXT864(0);
          do {
            uVar2 = *puVar39;
            auVar361._4_4_ = uVar2;
            auVar361._0_4_ = uVar2;
            auVar361._8_4_ = uVar2;
            auVar361._12_4_ = uVar2;
            auVar361._16_4_ = uVar2;
            auVar361._20_4_ = uVar2;
            auVar361._24_4_ = uVar2;
            auVar361._28_4_ = uVar2;
            uVar2 = puVar39[1];
            auVar370._4_4_ = uVar2;
            auVar370._0_4_ = uVar2;
            auVar370._8_4_ = uVar2;
            auVar370._12_4_ = uVar2;
            auVar370._16_4_ = uVar2;
            auVar370._20_4_ = uVar2;
            auVar370._24_4_ = uVar2;
            auVar370._28_4_ = uVar2;
            uVar2 = puVar39[2];
            auVar344._4_4_ = uVar2;
            auVar344._0_4_ = uVar2;
            auVar344._8_4_ = uVar2;
            auVar344._12_4_ = uVar2;
            auVar344._16_4_ = uVar2;
            auVar344._20_4_ = uVar2;
            auVar344._24_4_ = uVar2;
            auVar344._28_4_ = uVar2;
            uVar2 = puVar39[3];
            auVar292._4_4_ = uVar2;
            auVar292._0_4_ = uVar2;
            auVar292._8_4_ = uVar2;
            auVar292._12_4_ = uVar2;
            auVar292._16_4_ = uVar2;
            auVar292._20_4_ = uVar2;
            auVar292._24_4_ = uVar2;
            auVar292._28_4_ = uVar2;
            auVar271 = vlddqu_avx(*pauVar37);
            auVar91 = vlddqu_avx(pauVar37[1]);
            auVar78 = vcvtph2ps_f16c(auVar271._0_16_);
            auVar130 = vfmadd231ps_fma(auVar127._0_32_,auVar361,auVar78);
            auVar127 = ZEXT1664(auVar130);
            auVar271 = vcvtph2ps_f16c(auVar271._16_16_);
            auVar130 = vfmadd231ps_fma(auVar379._0_32_,auVar370,auVar271);
            auVar379 = ZEXT1664(auVar130);
            auVar271 = vcvtph2ps_f16c(auVar91._0_16_);
            auVar130 = vfmadd231ps_fma(auVar210._0_32_,auVar344,auVar271);
            auVar210 = ZEXT1664(auVar130);
            auVar271 = vcvtph2ps_f16c(auVar91._16_16_);
            auVar130 = vfmadd231ps_fma(auVar183._0_32_,auVar292,auVar271);
            auVar183 = ZEXT1664(auVar130);
            uVar2 = puVar39[4];
            auVar75._4_4_ = uVar2;
            auVar75._0_4_ = uVar2;
            auVar75._8_4_ = uVar2;
            auVar75._12_4_ = uVar2;
            auVar75._16_4_ = uVar2;
            auVar75._20_4_ = uVar2;
            auVar75._24_4_ = uVar2;
            auVar75._28_4_ = uVar2;
            uVar2 = puVar39[5];
            auVar234._4_4_ = uVar2;
            auVar234._0_4_ = uVar2;
            auVar234._8_4_ = uVar2;
            auVar234._12_4_ = uVar2;
            auVar234._16_4_ = uVar2;
            auVar234._20_4_ = uVar2;
            auVar234._24_4_ = uVar2;
            auVar234._28_4_ = uVar2;
            uVar2 = puVar39[6];
            auVar293._4_4_ = uVar2;
            auVar293._0_4_ = uVar2;
            auVar293._8_4_ = uVar2;
            auVar293._12_4_ = uVar2;
            auVar293._16_4_ = uVar2;
            auVar293._20_4_ = uVar2;
            auVar293._24_4_ = uVar2;
            auVar293._28_4_ = uVar2;
            uVar2 = puVar39[7];
            auVar313._4_4_ = uVar2;
            auVar313._0_4_ = uVar2;
            auVar313._8_4_ = uVar2;
            auVar313._12_4_ = uVar2;
            auVar313._16_4_ = uVar2;
            auVar313._20_4_ = uVar2;
            auVar313._24_4_ = uVar2;
            auVar313._28_4_ = uVar2;
            auVar271 = vlddqu_avx(pauVar37[2]);
            auVar91 = vlddqu_avx(pauVar37[3]);
            auVar78 = vcvtph2ps_f16c(auVar271._0_16_);
            auVar130 = vfmadd231ps_fma(auVar353._0_32_,auVar75,auVar78);
            auVar353 = ZEXT1664(auVar130);
            auVar78 = ZEXT1632(auVar130);
            auVar271 = vcvtph2ps_f16c(auVar271._16_16_);
            auVar130 = vfmadd231ps_fma(auVar265._0_32_,auVar234,auVar271);
            auVar265 = ZEXT1664(auVar130);
            auVar271 = ZEXT1632(auVar130);
            auVar89 = vcvtph2ps_f16c(auVar91._0_16_);
            auVar130 = vfmadd231ps_fma(auVar359._0_32_,auVar293,auVar89);
            auVar359 = ZEXT1664(auVar130);
            auVar89 = ZEXT1632(auVar130);
            auVar91 = vcvtph2ps_f16c(auVar91._16_16_);
            auVar130 = vfmadd231ps_fma(auVar334._0_32_,auVar313,auVar91);
            auVar334 = ZEXT1664(auVar130);
            auVar91 = ZEXT1632(auVar130);
            puVar39 = puVar39 + 8;
            pauVar37 = pauVar37 + 4;
            iVar41 = iVar41 + 8;
            uVar29 = uVar54 & 0xfffffff8;
          } while (iVar41 < (int)uVar54);
        }
        auVar182 = auVar379._0_32_;
        auVar181 = auVar210._0_32_;
        auVar126 = auVar183._0_32_;
        uVar44 = uVar29 | 3;
        while (auVar110 = auVar127._0_32_, (int)uVar44 < (int)uVar54) {
          uVar2 = *puVar39;
          auVar76._4_4_ = uVar2;
          auVar76._0_4_ = uVar2;
          auVar76._8_4_ = uVar2;
          auVar76._12_4_ = uVar2;
          auVar76._16_4_ = uVar2;
          auVar76._20_4_ = uVar2;
          auVar76._24_4_ = uVar2;
          auVar76._28_4_ = uVar2;
          uVar2 = puVar39[1];
          auVar235._4_4_ = uVar2;
          auVar235._0_4_ = uVar2;
          auVar235._8_4_ = uVar2;
          auVar235._12_4_ = uVar2;
          auVar235._16_4_ = uVar2;
          auVar235._20_4_ = uVar2;
          auVar235._24_4_ = uVar2;
          auVar235._28_4_ = uVar2;
          uVar2 = puVar39[2];
          auVar294._4_4_ = uVar2;
          auVar294._0_4_ = uVar2;
          auVar294._8_4_ = uVar2;
          auVar294._12_4_ = uVar2;
          auVar294._16_4_ = uVar2;
          auVar294._20_4_ = uVar2;
          auVar294._24_4_ = uVar2;
          auVar294._28_4_ = uVar2;
          uVar2 = puVar39[3];
          auVar314._4_4_ = uVar2;
          auVar314._0_4_ = uVar2;
          auVar314._8_4_ = uVar2;
          auVar314._12_4_ = uVar2;
          auVar314._16_4_ = uVar2;
          auVar314._20_4_ = uVar2;
          auVar314._24_4_ = uVar2;
          auVar314._28_4_ = uVar2;
          auVar126 = vlddqu_avx(*pauVar37);
          auVar23 = vlddqu_avx(pauVar37[1]);
          auVar181 = vcvtph2ps_f16c(auVar126._0_16_);
          auVar130 = vfmadd231ps_fma(auVar110,auVar76,auVar181);
          auVar127 = ZEXT1664(auVar130);
          auVar126 = vcvtph2ps_f16c(auVar126._16_16_);
          auVar130 = vfmadd231ps_fma(auVar379._0_32_,auVar235,auVar126);
          auVar379 = ZEXT1664(auVar130);
          auVar182 = ZEXT1632(auVar130);
          auVar126 = vcvtph2ps_f16c(auVar23._0_16_);
          auVar130 = vfmadd231ps_fma(auVar210._0_32_,auVar294,auVar126);
          auVar210 = ZEXT1664(auVar130);
          auVar181 = ZEXT1632(auVar130);
          auVar126 = vcvtph2ps_f16c(auVar23._16_16_);
          auVar130 = vfmadd231ps_fma(auVar183._0_32_,auVar314,auVar126);
          auVar183 = ZEXT1664(auVar130);
          auVar126 = ZEXT1632(auVar130);
          puVar39 = puVar39 + 4;
          pauVar37 = pauVar37 + 2;
          uVar44 = uVar29 + 7;
          uVar29 = uVar29 + 4;
        }
        if (uVar54 - uVar29 != 0 && (int)uVar29 <= (int)uVar54) {
          lVar42 = 0;
          do {
            uVar2 = puVar39[lVar42];
            auVar77._4_4_ = uVar2;
            auVar77._0_4_ = uVar2;
            auVar77._8_4_ = uVar2;
            auVar77._12_4_ = uVar2;
            auVar77._16_4_ = uVar2;
            auVar77._20_4_ = uVar2;
            auVar77._24_4_ = uVar2;
            auVar77._28_4_ = uVar2;
            auVar130 = vlddqu_avx(*(undefined1 (*) [16])*pauVar37);
            auVar110 = vcvtph2ps_f16c(auVar130);
            auVar130 = vfmadd231ps_fma(auVar127._0_32_,auVar77,auVar110);
            auVar127 = ZEXT1664(auVar130);
            auVar110 = ZEXT1632(auVar130);
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            lVar42 = lVar42 + 1;
          } while (uVar54 - uVar29 != (int)lVar42);
        }
        fVar95 = auVar89._0_4_ + auVar91._0_4_ + auVar78._0_4_ + auVar271._0_4_ +
                 auVar182._0_4_ + auVar126._0_4_ + auVar181._0_4_ + auVar110._0_4_;
        fVar128 = auVar89._4_4_ + auVar91._4_4_ + auVar78._4_4_ + auVar271._4_4_ +
                  auVar182._4_4_ + auVar126._4_4_ + auVar181._4_4_ + auVar110._4_4_;
        auVar111._0_8_ = CONCAT44(fVar128,fVar95);
        auVar111._8_4_ =
             auVar89._8_4_ + auVar91._8_4_ + auVar78._8_4_ + auVar271._8_4_ +
             auVar182._8_4_ + auVar126._8_4_ + auVar181._8_4_ + auVar110._8_4_;
        auVar111._12_4_ =
             auVar89._12_4_ + auVar91._12_4_ + auVar78._12_4_ + auVar271._12_4_ +
             auVar182._12_4_ + auVar126._12_4_ + auVar181._12_4_ + auVar110._12_4_;
        auVar111._16_4_ =
             auVar89._16_4_ + auVar91._16_4_ + auVar78._16_4_ + auVar271._16_4_ +
             auVar182._16_4_ + auVar126._16_4_ + auVar181._16_4_ + auVar110._16_4_;
        auVar111._20_4_ =
             auVar89._20_4_ + auVar91._20_4_ + auVar78._20_4_ + auVar271._20_4_ +
             auVar182._20_4_ + auVar126._20_4_ + auVar181._20_4_ + auVar110._20_4_;
        auVar111._24_4_ =
             auVar89._24_4_ + auVar91._24_4_ + auVar78._24_4_ + auVar271._24_4_ +
             auVar182._24_4_ + auVar126._24_4_ + auVar181._24_4_ + auVar110._24_4_;
        auVar111._28_4_ =
             auVar89._28_4_ + auVar91._28_4_ + auVar78._28_4_ + auVar271._28_4_ +
             auVar182._28_4_ + auVar126._28_4_ + auVar181._28_4_ + auVar110._28_4_;
        auVar271 = auVar287._0_32_;
        fVar306 = auVar287._0_4_;
        fVar318 = auVar287._4_4_;
        fVar184 = auVar287._8_4_;
        fVar319 = auVar287._12_4_;
        fVar320 = auVar287._16_4_;
        fVar321 = auVar287._20_4_;
        fVar322 = auVar287._24_4_;
        fVar323 = auVar287._28_4_;
        switch(uVar17) {
        case 1:
          auVar111 = vmaxps_avx(auVar111,_DAT_00559600);
          break;
        case 2:
          auVar271 = vmaxps_avx(auVar111,ZEXT432(0) << 0x20);
          auVar91 = vminps_avx(auVar111,ZEXT432(0) << 0x20);
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var18);
          auVar116._4_4_ = uVar2;
          auVar116._0_4_ = uVar2;
          auVar116._8_4_ = uVar2;
          auVar116._12_4_ = uVar2;
          auVar116._16_4_ = uVar2;
          auVar116._20_4_ = uVar2;
          auVar116._24_4_ = uVar2;
          auVar116._28_4_ = uVar2;
          auVar130 = vfmadd213ps_fma(auVar116,auVar91,auVar271);
          auVar111 = ZEXT1632(auVar130);
          break;
        case 3:
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var18);
          auVar84._4_4_ = uVar2;
          auVar84._0_4_ = uVar2;
          auVar84._8_4_ = uVar2;
          auVar84._12_4_ = uVar2;
          auVar84._16_4_ = uVar2;
          auVar84._20_4_ = uVar2;
          auVar84._24_4_ = uVar2;
          auVar84._28_4_ = uVar2;
          uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var18))[1];
          auVar166._4_4_ = uVar2;
          auVar166._0_4_ = uVar2;
          auVar166._8_4_ = uVar2;
          auVar166._12_4_ = uVar2;
          auVar166._16_4_ = uVar2;
          auVar166._20_4_ = uVar2;
          auVar166._24_4_ = uVar2;
          auVar166._28_4_ = uVar2;
          auVar271 = vmaxps_avx(auVar111,auVar84);
          auVar111 = vminps_avx(auVar271,auVar166);
          break;
        case 4:
          auVar85._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
          auVar85._8_4_ = -auVar111._8_4_;
          auVar85._12_4_ = -auVar111._12_4_;
          auVar85._16_4_ = -auVar111._16_4_;
          auVar85._20_4_ = -auVar111._20_4_;
          auVar85._24_4_ = -auVar111._24_4_;
          auVar85._28_4_ = -auVar111._28_4_;
          auVar112._8_4_ = 0x42b0c0a5;
          auVar112._0_8_ = 0x42b0c0a542b0c0a5;
          auVar112._12_4_ = 0x42b0c0a5;
          auVar112._16_4_ = 0x42b0c0a5;
          auVar112._20_4_ = 0x42b0c0a5;
          auVar112._24_4_ = 0x42b0c0a5;
          auVar112._28_4_ = 0x42b0c0a5;
          auVar91 = vminps_avx(auVar85,auVar112);
          auVar113._8_4_ = 0xc2b0c0a5;
          auVar113._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar113._12_4_ = 0xc2b0c0a5;
          auVar113._16_4_ = 0xc2b0c0a5;
          auVar113._20_4_ = 0xc2b0c0a5;
          auVar113._24_4_ = 0xc2b0c0a5;
          auVar113._28_4_ = 0xc2b0c0a5;
          auVar78 = vmaxps_avx(auVar91,auVar113);
          auVar114._8_4_ = 0x3fb8aa3b;
          auVar114._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar114._12_4_ = 0x3fb8aa3b;
          auVar114._16_4_ = 0x3fb8aa3b;
          auVar114._20_4_ = 0x3fb8aa3b;
          auVar114._24_4_ = 0x3fb8aa3b;
          auVar114._28_4_ = 0x3fb8aa3b;
          auVar237._8_4_ = 0x3f000000;
          auVar237._0_8_ = 0x3f0000003f000000;
          auVar237._12_4_ = 0x3f000000;
          auVar237._16_4_ = 0x3f000000;
          auVar237._20_4_ = 0x3f000000;
          auVar237._24_4_ = 0x3f000000;
          auVar237._28_4_ = 0x3f000000;
          auVar130 = vfmadd213ps_fma(auVar114,auVar78,auVar237);
          auVar89 = vroundps_avx(ZEXT1632(auVar130),1);
          auVar91 = vcmpps_avx(ZEXT1632(auVar130),auVar89,1);
          auVar91 = vandps_avx(auVar91,auVar271);
          auVar91 = vsubps_avx(auVar89,auVar91);
          auVar167._8_4_ = 0x3f318000;
          auVar167._0_8_ = 0x3f3180003f318000;
          auVar167._12_4_ = 0x3f318000;
          auVar167._16_4_ = 0x3f318000;
          auVar167._20_4_ = 0x3f318000;
          auVar167._24_4_ = 0x3f318000;
          auVar167._28_4_ = 0x3f318000;
          auVar130 = vfmsub231ps_fma(auVar78,auVar91,auVar167);
          auVar168._8_4_ = 0x395e8083;
          auVar168._0_8_ = 0x395e8083395e8083;
          auVar168._12_4_ = 0x395e8083;
          auVar168._16_4_ = 0x395e8083;
          auVar168._20_4_ = 0x395e8083;
          auVar168._24_4_ = 0x395e8083;
          auVar168._28_4_ = 0x395e8083;
          auVar185 = vfmsub231ps_fma(ZEXT1632(auVar130),auVar91,auVar168);
          auVar78 = ZEXT1632(auVar185);
          auVar27._28_4_ = 0x395e8083;
          auVar27._0_28_ =
               ZEXT1628(CONCAT412(auVar185._12_4_ * auVar185._12_4_,
                                  CONCAT48(auVar185._8_4_ * auVar185._8_4_,
                                           CONCAT44(auVar185._4_4_ * auVar185._4_4_,
                                                    auVar185._0_4_ * auVar185._0_4_))));
          auVar205._8_4_ = 0x39506967;
          auVar205._0_8_ = 0x3950696739506967;
          auVar205._12_4_ = 0x39506967;
          auVar205._16_4_ = 0x39506967;
          auVar205._20_4_ = 0x39506967;
          auVar205._24_4_ = 0x39506967;
          auVar205._28_4_ = 0x39506967;
          auVar253._8_4_ = 0x3ab743ce;
          auVar253._0_8_ = 0x3ab743ce3ab743ce;
          auVar253._12_4_ = 0x3ab743ce;
          auVar253._16_4_ = 0x3ab743ce;
          auVar253._20_4_ = 0x3ab743ce;
          auVar253._24_4_ = 0x3ab743ce;
          auVar253._28_4_ = 0x3ab743ce;
          auVar130 = vfmadd213ps_fma(auVar205,auVar78,auVar253);
          auVar254._8_4_ = 0x3c088908;
          auVar254._0_8_ = 0x3c0889083c088908;
          auVar254._12_4_ = 0x3c088908;
          auVar254._16_4_ = 0x3c088908;
          auVar254._20_4_ = 0x3c088908;
          auVar254._24_4_ = 0x3c088908;
          auVar254._28_4_ = 0x3c088908;
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar78,auVar254);
          auVar255._8_4_ = 0x3d2aa9c1;
          auVar255._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar255._12_4_ = 0x3d2aa9c1;
          auVar255._16_4_ = 0x3d2aa9c1;
          auVar255._20_4_ = 0x3d2aa9c1;
          auVar255._24_4_ = 0x3d2aa9c1;
          auVar255._28_4_ = 0x3d2aa9c1;
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar78,auVar255);
          auVar256._8_4_ = 0x3e2aaaaa;
          auVar256._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar256._12_4_ = 0x3e2aaaaa;
          auVar256._16_4_ = 0x3e2aaaaa;
          auVar256._20_4_ = 0x3e2aaaaa;
          auVar256._24_4_ = 0x3e2aaaaa;
          auVar256._28_4_ = 0x3e2aaaaa;
          auVar78 = ZEXT1632(auVar185);
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar78,auVar256);
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar78,auVar237);
          auVar214 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar27,auVar78);
          auVar61._0_4_ = (int)auVar91._0_4_;
          auVar61._4_4_ = (int)auVar91._4_4_;
          auVar61._8_4_ = (int)auVar91._8_4_;
          auVar61._12_4_ = (int)auVar91._12_4_;
          auVar86._16_4_ = (int)auVar91._16_4_;
          auVar86._0_16_ = auVar61;
          auVar86._20_4_ = (int)auVar91._20_4_;
          auVar86._24_4_ = (int)auVar91._24_4_;
          auVar86._28_4_ = (int)auVar91._28_4_;
          auVar185 = vpslld_avx(auVar61,0x17);
          auVar130 = vpslld_avx(auVar86._16_16_,0x17);
          auVar131._8_4_ = 0x3f800000;
          auVar131._0_8_ = 0x3f8000003f800000;
          auVar131._12_4_ = 0x3f800000;
          auVar130 = vpaddd_avx(auVar130,auVar131);
          auVar185 = vpaddd_avx(auVar185,auVar131);
          auVar115._16_16_ = auVar130;
          auVar115._0_16_ = auVar185;
          auVar87._0_4_ = auVar214._0_4_ + fVar306;
          auVar87._4_4_ = auVar214._4_4_ + fVar318;
          auVar87._8_4_ = auVar214._8_4_ + fVar184;
          auVar87._12_4_ = auVar214._12_4_ + fVar319;
          auVar87._16_4_ = fVar320 + 0.0;
          auVar87._20_4_ = fVar321 + 0.0;
          auVar87._24_4_ = fVar322 + 0.0;
          auVar87._28_4_ = fVar323 + 0.0;
          auVar130 = vfmadd213ps_fma(auVar115,auVar87,auVar271);
          auVar91 = vrcpps_avx(ZEXT1632(auVar130));
          auVar130 = vfmsub213ps_fma(ZEXT1632(auVar130),auVar91,auVar271);
          auVar130 = vfnmadd132ps_fma(ZEXT1632(auVar130),auVar91,auVar91);
          auVar111 = ZEXT1632(auVar130);
          break;
        case 5:
          auVar315._8_4_ = 0x42b0c0a5;
          auVar315._0_8_ = 0x42b0c0a542b0c0a5;
          auVar315._12_4_ = 0x42b0c0a5;
          auVar315._16_4_ = 0x42b0c0a5;
          auVar315._20_4_ = 0x42b0c0a5;
          auVar315._24_4_ = 0x42b0c0a5;
          auVar315._28_4_ = 0x42b0c0a5;
          auVar91 = vminps_avx(auVar315,auVar111);
          auVar330._8_4_ = 0xc2b0c0a5;
          auVar330._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar330._12_4_ = 0xc2b0c0a5;
          auVar330._16_4_ = 0xc2b0c0a5;
          auVar330._20_4_ = 0xc2b0c0a5;
          auVar330._24_4_ = 0xc2b0c0a5;
          auVar330._28_4_ = 0xc2b0c0a5;
          auVar78 = vmaxps_avx(auVar330,auVar91);
          auVar159._8_4_ = 0x3fb8aa3b;
          auVar159._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar159._12_4_ = 0x3fb8aa3b;
          auVar159._16_4_ = 0x3fb8aa3b;
          auVar159._20_4_ = 0x3fb8aa3b;
          auVar159._24_4_ = 0x3fb8aa3b;
          auVar159._28_4_ = 0x3fb8aa3b;
          auVar345._8_4_ = 0x3f000000;
          auVar345._0_8_ = 0x3f0000003f000000;
          auVar345._12_4_ = 0x3f000000;
          auVar345._16_4_ = 0x3f000000;
          auVar345._20_4_ = 0x3f000000;
          auVar345._24_4_ = 0x3f000000;
          auVar345._28_4_ = 0x3f000000;
          auVar130 = vfmadd213ps_fma(auVar159,auVar78,auVar345);
          auVar89 = vroundps_avx(ZEXT1632(auVar130),1);
          auVar91 = vcmpps_avx(ZEXT1632(auVar130),auVar89,1);
          auVar91 = vandps_avx(auVar91,auVar271);
          auVar91 = vsubps_avx(auVar89,auVar91);
          auVar356._8_4_ = 0x3f318000;
          auVar356._0_8_ = 0x3f3180003f318000;
          auVar356._12_4_ = 0x3f318000;
          auVar356._16_4_ = 0x3f318000;
          auVar356._20_4_ = 0x3f318000;
          auVar356._24_4_ = 0x3f318000;
          auVar356._28_4_ = 0x3f318000;
          auVar130 = vfmsub231ps_fma(auVar78,auVar91,auVar356);
          auVar350._8_4_ = 0xb95e8083;
          auVar350._0_8_ = 0xb95e8083b95e8083;
          auVar350._12_4_ = 0xb95e8083;
          auVar350._16_4_ = 0xb95e8083;
          auVar350._20_4_ = 0xb95e8083;
          auVar350._24_4_ = 0xb95e8083;
          auVar350._28_4_ = 0xb95e8083;
          auVar185 = vfnmsub231ps_fma(ZEXT1632(auVar130),auVar91,auVar350);
          auVar78 = ZEXT1632(auVar185);
          auVar24._28_4_ = auVar89._28_4_;
          auVar24._0_28_ =
               ZEXT1628(CONCAT412(auVar185._12_4_ * auVar185._12_4_,
                                  CONCAT48(auVar185._8_4_ * auVar185._8_4_,
                                           CONCAT44(auVar185._4_4_ * auVar185._4_4_,
                                                    auVar185._0_4_ * auVar185._0_4_))));
          auVar371._8_4_ = 0x39506967;
          auVar371._0_8_ = 0x3950696739506967;
          auVar371._12_4_ = 0x39506967;
          auVar371._16_4_ = 0x39506967;
          auVar371._20_4_ = 0x39506967;
          auVar371._24_4_ = 0x39506967;
          auVar371._28_4_ = 0x39506967;
          auVar362._8_4_ = 0x3ab743ce;
          auVar362._0_8_ = 0x3ab743ce3ab743ce;
          auVar362._12_4_ = 0x3ab743ce;
          auVar362._16_4_ = 0x3ab743ce;
          auVar362._20_4_ = 0x3ab743ce;
          auVar362._24_4_ = 0x3ab743ce;
          auVar362._28_4_ = 0x3ab743ce;
          auVar130 = vfmadd213ps_fma(auVar371,auVar78,auVar362);
          auVar377._8_4_ = 0x3c088908;
          auVar377._0_8_ = 0x3c0889083c088908;
          auVar377._12_4_ = 0x3c088908;
          auVar377._16_4_ = 0x3c088908;
          auVar377._20_4_ = 0x3c088908;
          auVar377._24_4_ = 0x3c088908;
          auVar377._28_4_ = 0x3c088908;
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar78,auVar377);
          auVar272._8_4_ = 0x3d2aa9c1;
          auVar272._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar272._12_4_ = 0x3d2aa9c1;
          auVar272._16_4_ = 0x3d2aa9c1;
          auVar272._20_4_ = 0x3d2aa9c1;
          auVar272._24_4_ = 0x3d2aa9c1;
          auVar272._28_4_ = 0x3d2aa9c1;
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar78,auVar272);
          auVar249._8_4_ = 0x3e2aaaaa;
          auVar249._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar249._12_4_ = 0x3e2aaaaa;
          auVar249._16_4_ = 0x3e2aaaaa;
          auVar249._20_4_ = 0x3e2aaaaa;
          auVar249._24_4_ = 0x3e2aaaaa;
          auVar249._28_4_ = 0x3e2aaaaa;
          auVar78 = ZEXT1632(auVar185);
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar78,auVar249);
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar78,auVar345);
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar24,auVar78);
          auVar79._0_4_ = fVar306 + auVar130._0_4_;
          auVar79._4_4_ = fVar318 + auVar130._4_4_;
          auVar79._8_4_ = fVar184 + auVar130._8_4_;
          auVar79._12_4_ = fVar319 + auVar130._12_4_;
          auVar79._16_4_ = fVar320 + 0.0;
          auVar79._20_4_ = fVar321 + 0.0;
          auVar79._24_4_ = fVar322 + 0.0;
          auVar79._28_4_ = fVar323 + 0.0;
          auVar129._0_4_ = (int)auVar91._0_4_;
          auVar129._4_4_ = (int)auVar91._4_4_;
          auVar129._8_4_ = (int)auVar91._8_4_;
          auVar129._12_4_ = (int)auVar91._12_4_;
          auVar160._16_4_ = (int)auVar91._16_4_;
          auVar160._0_16_ = auVar129;
          auVar160._20_4_ = (int)auVar91._20_4_;
          auVar160._24_4_ = (int)auVar91._24_4_;
          auVar160._28_4_ = (int)auVar91._28_4_;
          auVar185 = vpslld_avx(auVar129,0x17);
          auVar130 = vpslld_avx(auVar160._16_16_,0x17);
          auVar324._8_4_ = 0x3f800000;
          auVar324._0_8_ = 0x3f8000003f800000;
          auVar324._12_4_ = 0x3f800000;
          auVar130 = vpaddd_avx(auVar324,auVar130);
          auVar185 = vpaddd_avx(auVar324,auVar185);
          auVar161._16_16_ = auVar130;
          auVar161._0_16_ = auVar185;
          auVar214 = vfmadd213ps_fma(auVar161,auVar79,auVar271);
          auVar80._8_4_ = 0x800000;
          auVar80._0_8_ = 0x80000000800000;
          auVar80._12_4_ = 0x800000;
          auVar80._16_4_ = 0x800000;
          auVar80._20_4_ = 0x800000;
          auVar80._24_4_ = 0x800000;
          auVar80._28_4_ = 0x800000;
          auVar91 = vmaxps_avx(ZEXT1632(auVar214),auVar80);
          auVar185 = vpsrld_avx(auVar91._0_16_,0x17);
          auVar130 = vpsrld_avx(auVar91._16_16_,0x17);
          auVar201._8_4_ = 0x807fffff;
          auVar201._0_8_ = 0x807fffff807fffff;
          auVar201._12_4_ = 0x807fffff;
          auVar201._16_4_ = 0x807fffff;
          auVar201._20_4_ = 0x807fffff;
          auVar201._24_4_ = 0x807fffff;
          auVar201._28_4_ = 0x807fffff;
          auVar91 = vandps_avx(auVar91,auVar201);
          auVar89 = vorps_avx(auVar345,auVar91);
          auVar202._8_4_ = 0x3f3504f3;
          auVar202._0_8_ = 0x3f3504f33f3504f3;
          auVar202._12_4_ = 0x3f3504f3;
          auVar202._16_4_ = 0x3f3504f3;
          auVar202._20_4_ = 0x3f3504f3;
          auVar202._24_4_ = 0x3f3504f3;
          auVar202._28_4_ = 0x3f3504f3;
          auVar78 = vcmpps_avx(auVar202,auVar89,2);
          auVar91 = vandnps_avx(auVar78,auVar89);
          auVar363._8_4_ = 0xbf800000;
          auVar363._0_8_ = 0xbf800000bf800000;
          auVar363._12_4_ = 0xbf800000;
          auVar363._16_4_ = 0xbf800000;
          auVar363._20_4_ = 0xbf800000;
          auVar363._24_4_ = 0xbf800000;
          auVar363._28_4_ = 0xbf800000;
          auVar203._0_4_ = auVar89._0_4_ + -1.0 + auVar91._0_4_;
          auVar203._4_4_ = auVar89._4_4_ + -1.0 + auVar91._4_4_;
          auVar203._8_4_ = auVar89._8_4_ + -1.0 + auVar91._8_4_;
          auVar203._12_4_ = auVar89._12_4_ + -1.0 + auVar91._12_4_;
          auVar203._16_4_ = auVar89._16_4_ + -1.0 + auVar91._16_4_;
          auVar203._20_4_ = auVar89._20_4_ + -1.0 + auVar91._20_4_;
          auVar203._24_4_ = auVar89._24_4_ + -1.0 + auVar91._24_4_;
          auVar203._28_4_ = auVar89._28_4_ + -1.0 + auVar91._28_4_;
          auVar130 = vpsubd_avx(auVar130,auVar78._16_16_);
          auVar242._8_4_ = 0xffffff81;
          auVar242._0_8_ = 0xffffff81ffffff81;
          auVar242._12_4_ = 0xffffff81;
          auVar130 = vpaddd_avx(auVar130,auVar242);
          auVar185 = vpsubd_avx(auVar185,auVar78._0_16_);
          auVar185 = vpaddd_avx(auVar185,auVar242);
          auVar81._16_16_ = auVar130;
          auVar81._0_16_ = auVar185;
          auVar236._0_4_ = auVar203._0_4_ * auVar203._0_4_;
          auVar236._4_4_ = auVar203._4_4_ * auVar203._4_4_;
          auVar236._8_4_ = auVar203._8_4_ * auVar203._8_4_;
          auVar236._12_4_ = auVar203._12_4_ * auVar203._12_4_;
          auVar236._16_4_ = auVar203._16_4_ * auVar203._16_4_;
          auVar236._20_4_ = auVar203._20_4_ * auVar203._20_4_;
          auVar236._24_4_ = auVar203._24_4_ * auVar203._24_4_;
          auVar236._28_4_ = 0;
          auVar250._8_4_ = 0x3d9021bb;
          auVar250._0_8_ = 0x3d9021bb3d9021bb;
          auVar250._12_4_ = 0x3d9021bb;
          auVar250._16_4_ = 0x3d9021bb;
          auVar250._20_4_ = 0x3d9021bb;
          auVar250._24_4_ = 0x3d9021bb;
          auVar250._28_4_ = 0x3d9021bb;
          auVar295._8_4_ = 0xbdebd1b8;
          auVar295._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar295._12_4_ = 0xbdebd1b8;
          auVar295._16_4_ = 0xbdebd1b8;
          auVar295._20_4_ = 0xbdebd1b8;
          auVar295._24_4_ = 0xbdebd1b8;
          auVar295._28_4_ = 0xbdebd1b8;
          auVar130 = vfmadd213ps_fma(auVar250,auVar203,auVar295);
          auVar296._8_4_ = 0x3def251a;
          auVar296._0_8_ = 0x3def251a3def251a;
          auVar296._12_4_ = 0x3def251a;
          auVar296._16_4_ = 0x3def251a;
          auVar296._20_4_ = 0x3def251a;
          auVar296._24_4_ = 0x3def251a;
          auVar296._28_4_ = 0x3def251a;
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar203,auVar296);
          auVar297._8_4_ = 0xbdfe5d4f;
          auVar297._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar297._12_4_ = 0xbdfe5d4f;
          auVar297._16_4_ = 0xbdfe5d4f;
          auVar297._20_4_ = 0xbdfe5d4f;
          auVar297._24_4_ = 0xbdfe5d4f;
          auVar297._28_4_ = 0xbdfe5d4f;
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar203,auVar297);
          auVar298._8_4_ = 0x3e11e9bf;
          auVar298._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar298._12_4_ = 0x3e11e9bf;
          auVar298._16_4_ = 0x3e11e9bf;
          auVar298._20_4_ = 0x3e11e9bf;
          auVar298._24_4_ = 0x3e11e9bf;
          auVar298._28_4_ = 0x3e11e9bf;
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar203,auVar298);
          auVar299._8_4_ = 0xbe2aae50;
          auVar299._0_8_ = 0xbe2aae50be2aae50;
          auVar299._12_4_ = 0xbe2aae50;
          auVar299._16_4_ = 0xbe2aae50;
          auVar299._20_4_ = 0xbe2aae50;
          auVar299._24_4_ = 0xbe2aae50;
          auVar299._28_4_ = 0xbe2aae50;
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar203,auVar299);
          auVar300._8_4_ = 0x3e4cceac;
          auVar300._0_8_ = 0x3e4cceac3e4cceac;
          auVar300._12_4_ = 0x3e4cceac;
          auVar300._16_4_ = 0x3e4cceac;
          auVar300._20_4_ = 0x3e4cceac;
          auVar300._24_4_ = 0x3e4cceac;
          auVar300._28_4_ = 0x3e4cceac;
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar203,auVar300);
          auVar301._8_4_ = 0xbe7ffffc;
          auVar301._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar301._12_4_ = 0xbe7ffffc;
          auVar301._16_4_ = 0xbe7ffffc;
          auVar301._20_4_ = 0xbe7ffffc;
          auVar301._24_4_ = 0xbe7ffffc;
          auVar301._28_4_ = 0xbe7ffffc;
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar203,auVar301);
          auVar302._8_4_ = 0x3eaaaaaa;
          auVar302._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar302._12_4_ = 0x3eaaaaaa;
          auVar302._16_4_ = 0x3eaaaaaa;
          auVar302._20_4_ = 0x3eaaaaaa;
          auVar302._24_4_ = 0x3eaaaaaa;
          auVar302._28_4_ = 0x3eaaaaaa;
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar203,auVar302);
          auVar251._0_4_ = auVar236._0_4_ * auVar203._0_4_ * auVar130._0_4_;
          auVar251._4_4_ = auVar236._4_4_ * auVar203._4_4_ * auVar130._4_4_;
          auVar251._8_4_ = auVar236._8_4_ * auVar203._8_4_ * auVar130._8_4_;
          auVar251._12_4_ = auVar236._12_4_ * auVar203._12_4_ * auVar130._12_4_;
          auVar251._16_4_ = auVar236._16_4_ * auVar203._16_4_ * 0.0;
          auVar251._20_4_ = auVar236._20_4_ * auVar203._20_4_ * 0.0;
          auVar251._24_4_ = auVar236._24_4_ * auVar203._24_4_ * 0.0;
          auVar251._28_4_ = 0;
          auVar78 = vcvtdq2ps_avx(auVar81);
          auVar130 = vfmadd231ps_fma(auVar251,auVar78,auVar350);
          auVar130 = vfmsub231ps_fma(ZEXT1632(auVar130),auVar345,auVar236);
          auVar91 = vcmpps_avx(ZEXT1632(auVar214),_DAT_00559600,2);
          auVar89 = vsubps_avx(ZEXT1632(auVar130),auVar203);
          auVar130 = vfmsub231ps_fma(auVar89,auVar356,auVar78);
          auVar252._8_4_ = 0xc0000000;
          auVar252._0_8_ = 0xc0000000c0000000;
          auVar252._12_4_ = 0xc0000000;
          auVar252._16_4_ = 0xc0000000;
          auVar252._20_4_ = 0xc0000000;
          auVar252._24_4_ = 0xc0000000;
          auVar252._28_4_ = 0xc0000000;
          auVar25._4_4_ = auVar130._4_4_ * -2.0;
          auVar25._0_4_ = auVar130._0_4_ * -2.0;
          auVar25._8_4_ = auVar130._8_4_ * -2.0;
          auVar25._12_4_ = auVar130._12_4_ * -2.0;
          auVar25._16_4_ = 0x80000000;
          auVar25._20_4_ = 0x80000000;
          auVar25._24_4_ = 0x80000000;
          auVar25._28_4_ = auVar78._28_4_;
          auVar204._8_4_ = 0x7fffffff;
          auVar204._0_8_ = 0x7fffffff7fffffff;
          auVar204._12_4_ = 0x7fffffff;
          auVar204._16_4_ = 0x7fffffff;
          auVar204._20_4_ = 0x7fffffff;
          auVar204._24_4_ = 0x7fffffff;
          auVar204._28_4_ = 0x7fffffff;
          auVar91 = vblendvps_avx(auVar25,auVar204,auVar91);
          auVar162._8_4_ = 0x42b0c0a5;
          auVar162._0_8_ = 0x42b0c0a542b0c0a5;
          auVar162._12_4_ = 0x42b0c0a5;
          auVar162._16_4_ = 0x42b0c0a5;
          auVar162._20_4_ = 0x42b0c0a5;
          auVar162._24_4_ = 0x42b0c0a5;
          auVar162._28_4_ = 0x42b0c0a5;
          auVar91 = vminps_avx(auVar91,auVar162);
          auVar163._8_4_ = 0xc2b0c0a5;
          auVar163._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar163._12_4_ = 0xc2b0c0a5;
          auVar163._16_4_ = 0xc2b0c0a5;
          auVar163._20_4_ = 0xc2b0c0a5;
          auVar163._24_4_ = 0xc2b0c0a5;
          auVar163._28_4_ = 0xc2b0c0a5;
          auVar78 = vmaxps_avx(auVar91,auVar163);
          auVar164._8_4_ = 0x3fb8aa3b;
          auVar164._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar164._12_4_ = 0x3fb8aa3b;
          auVar164._16_4_ = 0x3fb8aa3b;
          auVar164._20_4_ = 0x3fb8aa3b;
          auVar164._24_4_ = 0x3fb8aa3b;
          auVar164._28_4_ = 0x3fb8aa3b;
          auVar130 = vfmadd213ps_fma(auVar164,auVar78,auVar345);
          auVar89 = vroundps_avx(ZEXT1632(auVar130),1);
          auVar91 = vcmpps_avx(ZEXT1632(auVar130),auVar89,1);
          auVar91 = vandps_avx(auVar271,auVar91);
          auVar91 = vsubps_avx(auVar89,auVar91);
          auVar130 = vfmsub231ps_fma(auVar78,auVar91,auVar356);
          auVar185 = vfnmsub231ps_fma(ZEXT1632(auVar130),auVar91,auVar350);
          auVar78 = ZEXT1632(auVar185);
          auVar26._28_4_ = auVar89._28_4_;
          auVar26._0_28_ =
               ZEXT1628(CONCAT412(auVar185._12_4_ * auVar185._12_4_,
                                  CONCAT48(auVar185._8_4_ * auVar185._8_4_,
                                           CONCAT44(auVar185._4_4_ * auVar185._4_4_,
                                                    auVar185._0_4_ * auVar185._0_4_))));
          auVar303._8_4_ = 0x3ab743ce;
          auVar303._0_8_ = 0x3ab743ce3ab743ce;
          auVar303._12_4_ = 0x3ab743ce;
          auVar303._16_4_ = 0x3ab743ce;
          auVar303._20_4_ = 0x3ab743ce;
          auVar303._24_4_ = 0x3ab743ce;
          auVar303._28_4_ = 0x3ab743ce;
          auVar130 = vfmadd213ps_fma(auVar371,auVar78,auVar303);
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar78,auVar377);
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar78,auVar272);
          auVar287 = ZEXT3264(auVar271);
          auVar304._8_4_ = 0x3e2aaaaa;
          auVar304._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar304._12_4_ = 0x3e2aaaaa;
          auVar304._16_4_ = 0x3e2aaaaa;
          auVar304._20_4_ = 0x3e2aaaaa;
          auVar304._24_4_ = 0x3e2aaaaa;
          auVar304._28_4_ = 0x3e2aaaaa;
          auVar78 = ZEXT1632(auVar185);
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar78,auVar304);
          auVar130 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar78,auVar345);
          auVar214 = vfmadd213ps_fma(ZEXT1632(auVar130),auVar26,auVar78);
          auVar60._0_4_ = (int)auVar91._0_4_;
          auVar60._4_4_ = (int)auVar91._4_4_;
          auVar60._8_4_ = (int)auVar91._8_4_;
          auVar60._12_4_ = (int)auVar91._12_4_;
          auVar82._16_4_ = (int)auVar91._16_4_;
          auVar82._0_16_ = auVar60;
          auVar82._20_4_ = (int)auVar91._20_4_;
          auVar82._24_4_ = (int)auVar91._24_4_;
          auVar82._28_4_ = (int)auVar91._28_4_;
          auVar185 = vpslld_avx(auVar60,0x17);
          auVar130 = vpslld_avx(auVar82._16_16_,0x17);
          auVar130 = vpaddd_avx(auVar324,auVar130);
          auVar185 = vpaddd_avx(auVar324,auVar185);
          auVar83._16_16_ = auVar130;
          auVar83._0_16_ = auVar185;
          auVar165._0_4_ = fVar306 + auVar214._0_4_;
          auVar165._4_4_ = fVar318 + auVar214._4_4_;
          auVar165._8_4_ = fVar184 + auVar214._8_4_;
          auVar165._12_4_ = fVar319 + auVar214._12_4_;
          auVar165._16_4_ = fVar320 + 0.0;
          auVar165._20_4_ = fVar321 + 0.0;
          auVar165._24_4_ = fVar322 + 0.0;
          auVar165._28_4_ = fVar323 + 0.0;
          auVar130 = vfmadd213ps_fma(auVar83,auVar165,auVar271);
          auVar91 = vrcpps_avx(ZEXT1632(auVar130));
          auVar130 = vfmsub213ps_fma(ZEXT1632(auVar130),auVar91,auVar271);
          auVar130 = vfnmadd132ps_fma(ZEXT1632(auVar130),auVar91,auVar91);
          auVar130 = vfnmadd213ps_fma(ZEXT1632(auVar130),auVar252,auVar363);
          auVar74 = ZEXT1628(auVar130);
          goto LAB_002d5f96;
        case 6:
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var18);
          auVar88._4_4_ = uVar2;
          auVar88._0_4_ = uVar2;
          auVar88._8_4_ = uVar2;
          auVar88._12_4_ = uVar2;
          auVar88._16_4_ = uVar2;
          auVar88._20_4_ = uVar2;
          auVar88._24_4_ = uVar2;
          auVar88._28_4_ = uVar2;
          uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var18))[1];
          auVar169._4_4_ = uVar2;
          auVar169._0_4_ = uVar2;
          auVar169._8_4_ = uVar2;
          auVar169._12_4_ = uVar2;
          auVar169._16_4_ = uVar2;
          auVar169._20_4_ = uVar2;
          auVar169._24_4_ = uVar2;
          auVar169._28_4_ = uVar2;
          auVar130 = vfmadd231ps_fma(auVar169,auVar111,auVar88);
          auVar91 = vmaxps_avx(ZEXT1632(auVar130),_DAT_00559600);
          auVar271 = vminps_avx(auVar91,auVar271);
          auVar74 = auVar271._0_28_;
LAB_002d5f96:
          auVar111._4_4_ = auVar74._4_4_ * fVar128;
          auVar111._0_4_ = auVar74._0_4_ * fVar95;
          auVar111._8_4_ = auVar74._8_4_ * auVar111._8_4_;
          auVar111._12_4_ = auVar74._12_4_ * auVar111._12_4_;
          auVar111._16_4_ = auVar74._16_4_ * auVar111._16_4_;
          auVar111._20_4_ = auVar74._20_4_ * auVar111._20_4_;
          auVar111._24_4_ = auVar74._24_4_ * auVar111._24_4_;
        }
        *(undefined1 (*) [32])((long)top_blob->data + uVar32 * 0x20) = auVar111;
        uVar32 = uVar32 + 1;
      } while (uVar32 != uVar30);
    }
    iVar41 = 0;
  }
LAB_002d7c3b:
  if ((int *)local_308._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_308._8_8_ = *(int *)local_308._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_308._8_8_ == 0) {
      if (local_2e8 == (Allocator *)0x0) {
        if ((void *)local_308._0_8_ != (void *)0x0) {
          free((void *)local_308._0_8_);
        }
      }
      else {
        (*local_2e8->_vptr_Allocator[3])();
      }
    }
  }
  return iVar41;
}

Assistant:

int InnerProduct_x86_fma::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}